

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  uint16_t *in_RDI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  ulong uVar16;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  int i;
  __m128i q [7];
  __m128i p [7];
  int i_1;
  int flat2_mask;
  __m128i sum_p;
  __m128i sum_q3;
  __m128i sum_p3;
  __m128i sum_q6;
  __m128i sum_p6;
  __m128i sum_lq;
  __m128i sum_lp;
  __m128i sum_q;
  __m128i sum_p_0;
  __m128i four;
  __m128i eight;
  __m128i flat2_q [6];
  __m128i flat2_p [6];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i qs [2];
  __m128i ps [2];
  __m128i flat2;
  __m128i flat;
  __m128i mask;
  __m128i zero;
  __m128i t80;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i *palVar20;
  __m128i *flat2_00;
  __m128i *thr_out;
  __m128i *palVar21;
  undefined4 in_stack_ffffffffffffe870;
  undefined2 in_stack_ffffffffffffe874;
  undefined2 in_stack_ffffffffffffe876;
  int local_174c;
  longlong local_1748 [7];
  __m128i *in_stack_ffffffffffffe8f0;
  __m128i *in_stack_ffffffffffffe8f8;
  __m128i *in_stack_ffffffffffffe900;
  __m128i *in_stack_ffffffffffffe908;
  __m128i *in_stack_ffffffffffffe910;
  __m128i *in_stack_ffffffffffffe918;
  longlong local_16d8 [15];
  uint8_t *local_1660;
  uint8_t *local_1658;
  uint8_t *local_1650;
  uint8_t *local_1648;
  int local_163c;
  uint16_t *local_1638;
  int local_1630;
  uint local_162c;
  short local_1628;
  short sStack_1626;
  short sStack_1624;
  short sStack_1622;
  short sStack_1620;
  short sStack_161e;
  short sStack_161c;
  short sStack_161a;
  short local_1618;
  short sStack_1616;
  short sStack_1614;
  short sStack_1612;
  short sStack_1610;
  short sStack_160e;
  short sStack_160c;
  short sStack_160a;
  short local_1608;
  short sStack_1606;
  short sStack_1604;
  short sStack_1602;
  short sStack_1600;
  short sStack_15fe;
  short sStack_15fc;
  short sStack_15fa;
  short local_15f8;
  short sStack_15f6;
  short sStack_15f4;
  short sStack_15f2;
  short sStack_15f0;
  short sStack_15ee;
  short sStack_15ec;
  short sStack_15ea;
  short local_15e8;
  short sStack_15e6;
  short sStack_15e4;
  short sStack_15e2;
  short sStack_15e0;
  short sStack_15de;
  short sStack_15dc;
  short sStack_15da;
  short local_15d8;
  short sStack_15d6;
  short sStack_15d4;
  short sStack_15d2;
  short sStack_15d0;
  short sStack_15ce;
  short sStack_15cc;
  short sStack_15ca;
  short local_15c8;
  short sStack_15c6;
  short sStack_15c4;
  short sStack_15c2;
  short sStack_15c0;
  short sStack_15be;
  short sStack_15bc;
  short sStack_15ba;
  short local_15b8;
  short sStack_15b6;
  short sStack_15b4;
  short sStack_15b2;
  short sStack_15b0;
  short sStack_15ae;
  short sStack_15ac;
  short sStack_15aa;
  short local_15a8;
  short sStack_15a6;
  short sStack_15a4;
  short sStack_15a2;
  short sStack_15a0;
  short sStack_159e;
  short sStack_159c;
  short sStack_159a;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  ushort local_1568;
  ushort uStack_1566;
  ushort uStack_1564;
  ushort uStack_1562;
  ushort uStack_1560;
  ushort uStack_155e;
  ushort uStack_155c;
  ushort uStack_155a;
  ushort local_1558;
  ushort uStack_1556;
  ushort uStack_1554;
  ushort uStack_1552;
  ushort uStack_1550;
  ushort uStack_154e;
  ushort uStack_154c;
  ushort uStack_154a;
  ushort local_1548;
  ushort uStack_1546;
  ushort uStack_1544;
  ushort uStack_1542;
  ushort uStack_1540;
  ushort uStack_153e;
  ushort uStack_153c;
  ushort uStack_153a;
  ushort local_1538;
  ushort uStack_1536;
  ushort uStack_1534;
  ushort uStack_1532;
  ushort uStack_1530;
  ushort uStack_152e;
  ushort uStack_152c;
  ushort uStack_152a;
  ushort local_1528;
  ushort uStack_1526;
  ushort uStack_1524;
  ushort uStack_1522;
  ushort uStack_1520;
  ushort uStack_151e;
  ushort uStack_151c;
  ushort uStack_151a;
  undefined8 local_1518;
  undefined8 uStack_1510;
  ushort local_1508;
  ushort uStack_1506;
  ushort uStack_1504;
  ushort uStack_1502;
  ushort uStack_1500;
  ushort uStack_14fe;
  ushort uStack_14fc;
  ushort uStack_14fa;
  ushort local_14f8;
  ushort uStack_14f6;
  ushort uStack_14f4;
  ushort uStack_14f2;
  ushort uStack_14f0;
  ushort uStack_14ee;
  ushort uStack_14ec;
  ushort uStack_14ea;
  ushort local_14e8;
  ushort uStack_14e6;
  ushort uStack_14e4;
  ushort uStack_14e2;
  ushort uStack_14e0;
  ushort uStack_14de;
  ushort uStack_14dc;
  ushort uStack_14da;
  ushort local_14d8;
  ushort uStack_14d6;
  ushort uStack_14d4;
  ushort uStack_14d2;
  ushort uStack_14d0;
  ushort uStack_14ce;
  ushort uStack_14cc;
  ushort uStack_14ca;
  ushort local_14c8;
  ushort uStack_14c6;
  ushort uStack_14c4;
  ushort uStack_14c2;
  ushort uStack_14c0;
  ushort uStack_14be;
  ushort uStack_14bc;
  ushort uStack_14ba;
  ushort local_14b8;
  ushort uStack_14b6;
  ushort uStack_14b4;
  ushort uStack_14b2;
  ushort uStack_14b0;
  ushort uStack_14ae;
  ushort uStack_14ac;
  ushort uStack_14aa;
  ushort local_14a8;
  ushort uStack_14a6;
  ushort uStack_14a4;
  ushort uStack_14a2;
  ushort uStack_14a0;
  ushort uStack_149e;
  ushort uStack_149c;
  ushort uStack_149a;
  undefined8 local_1498;
  undefined8 uStack_1490;
  ushort local_1488;
  ushort uStack_1486;
  ushort uStack_1484;
  ushort uStack_1482;
  ushort uStack_1480;
  ushort uStack_147e;
  ushort uStack_147c;
  ushort uStack_147a;
  ushort local_1478;
  ushort uStack_1476;
  ushort uStack_1474;
  ushort uStack_1472;
  ushort uStack_1470;
  ushort uStack_146e;
  ushort uStack_146c;
  ushort uStack_146a;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  longlong local_1448;
  longlong lStack_1440;
  ulong local_1438 [4];
  ulong local_1418;
  ulong uStack_1410;
  ulong local_1408;
  ulong uStack_1400;
  ulong local_13f8;
  ulong uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  longlong local_13d8 [2];
  longlong local_13c8 [2];
  longlong local_13b8 [2];
  longlong local_13a8 [3];
  int local_138c;
  uint8_t *local_1378;
  uint8_t *local_1370;
  uint8_t *local_1368;
  uint8_t *local_1360;
  __m128i *local_1358;
  __m128i *local_1350;
  longlong local_1348;
  longlong lStack_1340;
  uint16_t *local_1330;
  longlong local_1328;
  longlong lStack_1320;
  uint16_t *local_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  ulong local_12f8;
  ulong uStack_12f0;
  ulong local_12e8;
  ulong uStack_12e0;
  ulong local_12d8;
  ulong uStack_12d0;
  ulong local_12c8;
  ulong uStack_12c0;
  ulong local_12b8;
  ulong uStack_12b0;
  ulong local_12a8;
  ulong uStack_12a0;
  ulong local_1298;
  ulong uStack_1290;
  ulong local_1288;
  ulong uStack_1280;
  ulong local_1278;
  ulong uStack_1270;
  ulong local_1268;
  ulong uStack_1260;
  ulong local_1258;
  ulong uStack_1250;
  ulong local_1248;
  ulong uStack_1240;
  ulong local_1238;
  ulong uStack_1230;
  ulong local_1228;
  ulong uStack_1220;
  ulong local_1218;
  ulong uStack_1210;
  ulong local_1208;
  ulong uStack_1200;
  ulong local_11f8;
  ulong uStack_11f0;
  ulong local_11e8;
  ulong uStack_11e0;
  ulong local_11d8;
  ulong uStack_11d0;
  ulong local_11c8;
  ulong uStack_11c0;
  short local_11b8;
  short sStack_11b6;
  short sStack_11b4;
  short sStack_11b2;
  short sStack_11b0;
  short sStack_11ae;
  short sStack_11ac;
  ushort uStack_11aa;
  short local_11a8;
  short sStack_11a6;
  short sStack_11a4;
  short sStack_11a2;
  short sStack_11a0;
  short sStack_119e;
  short sStack_119c;
  ushort uStack_119a;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined2 local_114c;
  undefined2 local_114a;
  short local_1148;
  short sStack_1146;
  short sStack_1144;
  short sStack_1142;
  short sStack_1140;
  short sStack_113e;
  short sStack_113c;
  short sStack_113a;
  undefined8 local_1138;
  undefined8 uStack_1130;
  short local_1128;
  short sStack_1126;
  short sStack_1124;
  short sStack_1122;
  short sStack_1120;
  short sStack_111e;
  short sStack_111c;
  short sStack_111a;
  undefined8 local_1118;
  undefined8 uStack_1110;
  short local_1108;
  short sStack_1106;
  short sStack_1104;
  short sStack_1102;
  short sStack_1100;
  short sStack_10fe;
  short sStack_10fc;
  short sStack_10fa;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  short local_10c8;
  short sStack_10c6;
  short sStack_10c4;
  short sStack_10c2;
  short sStack_10c0;
  short sStack_10be;
  short sStack_10bc;
  short sStack_10ba;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  short local_10a8;
  short sStack_10a6;
  short sStack_10a4;
  short sStack_10a2;
  short sStack_10a0;
  short sStack_109e;
  short sStack_109c;
  short sStack_109a;
  undefined8 local_1098;
  undefined8 uStack_1090;
  short local_1088;
  short sStack_1086;
  short sStack_1084;
  short sStack_1082;
  short sStack_1080;
  short sStack_107e;
  short sStack_107c;
  short sStack_107a;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  short local_1008;
  short sStack_1006;
  short sStack_1004;
  short sStack_1002;
  short sStack_1000;
  short sStack_ffe;
  short sStack_ffc;
  short sStack_ffa;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  short local_fe8;
  short sStack_fe6;
  short sStack_fe4;
  short sStack_fe2;
  short sStack_fe0;
  short sStack_fde;
  short sStack_fdc;
  short sStack_fda;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  short local_fc8;
  short sStack_fc6;
  short sStack_fc4;
  short sStack_fc2;
  short sStack_fc0;
  short sStack_fbe;
  short sStack_fbc;
  short sStack_fba;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  short local_f88;
  short sStack_f86;
  short sStack_f84;
  short sStack_f82;
  short sStack_f80;
  short sStack_f7e;
  short sStack_f7c;
  short sStack_f7a;
  undefined8 local_f78;
  undefined8 uStack_f70;
  short local_f68;
  short sStack_f66;
  short sStack_f64;
  short sStack_f62;
  short sStack_f60;
  short sStack_f5e;
  short sStack_f5c;
  short sStack_f5a;
  undefined8 local_f58;
  undefined8 uStack_f50;
  short local_f48;
  short sStack_f46;
  short sStack_f44;
  short sStack_f42;
  short sStack_f40;
  short sStack_f3e;
  short sStack_f3c;
  short sStack_f3a;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  short local_ec8;
  short sStack_ec6;
  short sStack_ec4;
  short sStack_ec2;
  short sStack_ec0;
  short sStack_ebe;
  short sStack_ebc;
  short sStack_eba;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  short local_ea8;
  short sStack_ea6;
  short sStack_ea4;
  short sStack_ea2;
  short sStack_ea0;
  short sStack_e9e;
  short sStack_e9c;
  short sStack_e9a;
  undefined8 local_e98;
  undefined8 uStack_e90;
  short local_e88;
  short sStack_e86;
  short sStack_e84;
  short sStack_e82;
  short sStack_e80;
  short sStack_e7e;
  short sStack_e7c;
  short sStack_e7a;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  short local_e48;
  short sStack_e46;
  short sStack_e44;
  short sStack_e42;
  short sStack_e40;
  short sStack_e3e;
  short sStack_e3c;
  short sStack_e3a;
  undefined8 local_e38;
  undefined8 uStack_e30;
  short local_e28;
  short sStack_e26;
  short sStack_e24;
  short sStack_e22;
  short sStack_e20;
  short sStack_e1e;
  short sStack_e1c;
  short sStack_e1a;
  undefined8 local_e18;
  undefined8 uStack_e10;
  short local_e08;
  short sStack_e06;
  short sStack_e04;
  short sStack_e02;
  short sStack_e00;
  short sStack_dfe;
  short sStack_dfc;
  short sStack_dfa;
  undefined8 local_df8;
  int in_stack_fffffffffffff210;
  short sStack_dec;
  short sStack_dea;
  __m128i *in_stack_fffffffffffff218;
  short sStack_de0;
  short sStack_dde;
  short sStack_ddc;
  short sStack_dda;
  short local_dd8;
  short sStack_dd6;
  short sStack_dd4;
  short sStack_dd2;
  short sStack_dd0;
  short sStack_dce;
  short sStack_dcc;
  short sStack_dca;
  short local_dc8;
  short sStack_dc6;
  short sStack_dc4;
  short sStack_dc2;
  short sStack_dc0;
  short sStack_dbe;
  short sStack_dbc;
  short sStack_dba;
  short local_da8;
  short sStack_da6;
  short sStack_da4;
  short sStack_da2;
  short sStack_da0;
  short sStack_d9e;
  short sStack_d9c;
  short sStack_d9a;
  short local_d38;
  short sStack_d36;
  short sStack_d34;
  short sStack_d32;
  short sStack_d30;
  short sStack_d2e;
  short sStack_d2c;
  short sStack_d2a;
  short local_d28;
  short sStack_d26;
  short sStack_d24;
  short sStack_d22;
  short sStack_d20;
  short sStack_d1e;
  short sStack_d1c;
  short sStack_d1a;
  short local_d18;
  short sStack_d16;
  short sStack_d14;
  short sStack_d12;
  short sStack_d10;
  short sStack_d0e;
  short sStack_d0c;
  short sStack_d0a;
  short local_cb8;
  short sStack_cb6;
  short sStack_cb4;
  short sStack_cb2;
  short sStack_cb0;
  short sStack_cae;
  short sStack_cac;
  short sStack_caa;
  short local_ca8;
  short sStack_ca6;
  short sStack_ca4;
  short sStack_ca2;
  short sStack_ca0;
  short sStack_c9e;
  short sStack_c9c;
  short sStack_c9a;
  short local_c98;
  short sStack_c96;
  short sStack_c94;
  short sStack_c92;
  short sStack_c90;
  short sStack_c8e;
  short sStack_c8c;
  short sStack_c8a;
  short local_c88;
  short sStack_c86;
  short sStack_c84;
  short sStack_c82;
  short sStack_c80;
  short sStack_c7e;
  short sStack_c7c;
  short sStack_c7a;
  short local_c68;
  short sStack_c66;
  short sStack_c64;
  short sStack_c62;
  short sStack_c60;
  short sStack_c5e;
  short sStack_c5c;
  short sStack_c5a;
  short local_bf8;
  short sStack_bf6;
  short sStack_bf4;
  short sStack_bf2;
  short sStack_bf0;
  short sStack_bee;
  short sStack_bec;
  short sStack_bea;
  short local_be8;
  short sStack_be6;
  short sStack_be4;
  short sStack_be2;
  short sStack_be0;
  short sStack_bde;
  short sStack_bdc;
  short sStack_bda;
  short local_bd8;
  short sStack_bd6;
  short sStack_bd4;
  short sStack_bd2;
  short sStack_bd0;
  short sStack_bce;
  short sStack_bcc;
  short sStack_bca;
  short local_b78;
  short sStack_b76;
  short sStack_b74;
  short sStack_b72;
  short sStack_b70;
  short sStack_b6e;
  short sStack_b6c;
  short sStack_b6a;
  short local_b68;
  short sStack_b66;
  short sStack_b64;
  short sStack_b62;
  short sStack_b60;
  short sStack_b5e;
  short sStack_b5c;
  short sStack_b5a;
  short local_b58;
  short sStack_b56;
  short sStack_b54;
  short sStack_b52;
  short sStack_b50;
  short sStack_b4e;
  short sStack_b4c;
  short sStack_b4a;
  short local_b08;
  short sStack_b06;
  short sStack_b04;
  short sStack_b02;
  short sStack_b00;
  short sStack_afe;
  short sStack_afc;
  short sStack_afa;
  short local_af8;
  short sStack_af6;
  short sStack_af4;
  short sStack_af2;
  short sStack_af0;
  short sStack_aee;
  short sStack_aec;
  short sStack_aea;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  short local_ad8;
  short sStack_ad6;
  short sStack_ad4;
  short sStack_ad2;
  short sStack_ad0;
  short sStack_ace;
  short sStack_acc;
  short sStack_aca;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short sStack_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  short local_a78;
  short sStack_a76;
  short sStack_a74;
  short sStack_a72;
  short sStack_a70;
  short sStack_a6e;
  short sStack_a6c;
  short sStack_a6a;
  short local_a68;
  short sStack_a66;
  short sStack_a64;
  short sStack_a62;
  short sStack_a60;
  short sStack_a5e;
  short sStack_a5c;
  short sStack_a5a;
  short local_a58;
  short sStack_a56;
  short sStack_a54;
  short sStack_a52;
  short sStack_a50;
  short sStack_a4e;
  short sStack_a4c;
  short sStack_a4a;
  short local_a28;
  short sStack_a26;
  short sStack_a24;
  short sStack_a22;
  short sStack_a20;
  short sStack_a1e;
  short sStack_a1c;
  short sStack_a1a;
  short local_9e8;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  short local_9a8;
  short sStack_9a6;
  short sStack_9a4;
  short sStack_9a2;
  short sStack_9a0;
  short sStack_99e;
  short sStack_99c;
  short sStack_99a;
  short local_968;
  short sStack_966;
  short sStack_964;
  short sStack_962;
  short sStack_960;
  short sStack_95e;
  short sStack_95c;
  short sStack_95a;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short sStack_920;
  short sStack_91e;
  short sStack_91c;
  short sStack_91a;
  short local_8f8;
  short sStack_8f6;
  short sStack_8f4;
  short sStack_8f2;
  short sStack_8f0;
  short sStack_8ee;
  short sStack_8ec;
  short sStack_8ea;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short sStack_8d0;
  short sStack_8ce;
  short sStack_8cc;
  short sStack_8ca;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short sStack_8b0;
  short sStack_8ae;
  short sStack_8ac;
  short sStack_8aa;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_818;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_810;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  short local_758;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short sStack_750;
  short sStack_74e;
  short sStack_74c;
  short sStack_74a;
  short local_748;
  short sStack_746;
  short sStack_744;
  short sStack_742;
  short sStack_740;
  short sStack_73e;
  short sStack_73c;
  short sStack_73a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6f0;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short sStack_6d0;
  short sStack_6ce;
  short sStack_6cc;
  short sStack_6ca;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  short local_6a8;
  short sStack_6a6;
  short sStack_6a4;
  short sStack_6a2;
  short sStack_6a0;
  short sStack_69e;
  short sStack_69c;
  short sStack_69a;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_690;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_668;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short sStack_660;
  short sStack_65e;
  short sStack_65c;
  short sStack_65a;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  short local_648;
  short sStack_646;
  short sStack_644;
  short sStack_642;
  short sStack_640;
  short sStack_63e;
  short sStack_63c;
  short sStack_63a;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  short local_608;
  short sStack_606;
  short sStack_604;
  short sStack_602;
  short sStack_600;
  short sStack_5fe;
  short sStack_5fc;
  short sStack_5fa;
  short local_5e8;
  short sStack_5e6;
  short sStack_5e4;
  short sStack_5e2;
  short sStack_5e0;
  short sStack_5de;
  short sStack_5dc;
  short sStack_5da;
  short local_5c8;
  short sStack_5c6;
  short sStack_5c4;
  short sStack_5c2;
  short sStack_5c0;
  short sStack_5be;
  short sStack_5bc;
  short sStack_5ba;
  short local_5a8;
  short sStack_5a6;
  short sStack_5a4;
  short sStack_5a2;
  short sStack_5a0;
  short sStack_59e;
  short sStack_59c;
  short sStack_59a;
  short local_588;
  short sStack_586;
  short sStack_584;
  short sStack_582;
  short sStack_580;
  short sStack_57e;
  short sStack_57c;
  short sStack_57a;
  short local_568;
  short sStack_566;
  short sStack_564;
  short sStack_562;
  short sStack_560;
  short sStack_55e;
  short sStack_55c;
  short sStack_55a;
  short local_548;
  short sStack_546;
  short sStack_544;
  short sStack_542;
  short sStack_540;
  short sStack_53e;
  short sStack_53c;
  short sStack_53a;
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  short sStack_520;
  short sStack_51e;
  short sStack_51c;
  short sStack_51a;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  short local_4e8;
  short sStack_4e6;
  short sStack_4e4;
  short sStack_4e2;
  short sStack_4e0;
  short sStack_4de;
  short sStack_4dc;
  short sStack_4da;
  short local_4c8;
  short sStack_4c6;
  short sStack_4c4;
  short sStack_4c2;
  short sStack_4c0;
  short sStack_4be;
  short sStack_4bc;
  short sStack_4ba;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short sStack_4a0;
  short sStack_49e;
  short sStack_49c;
  short sStack_49a;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  int bd_00;
  
  local_1660 = in_R9;
  local_1658 = in_R8;
  local_1650 = in_RCX;
  local_1648 = in_RDX;
  local_163c = in_ESI;
  local_1638 = in_RDI;
  load_highbd_pixel(in_RDI,7,in_ESI,(__m128i *)local_16d8,(__m128i *)local_1748);
  local_1360 = local_1648;
  local_1368 = local_1650;
  local_1370 = local_1658;
  local_1378 = local_1660;
  local_138c = in_stack_00000018;
  local_1308 = 0;
  uStack_1300 = 0;
  local_13e8 = 0;
  uStack_13e0 = 0;
  palVar21 = &local_13d8;
  thr_out = &local_13c8;
  palVar20 = (__m128i *)local_13a8;
  flat2_00 = &local_13b8;
  local_1358 = (__m128i *)local_1748;
  local_1350 = (__m128i *)local_16d8;
  get_limit_dual(local_1648,local_1650,local_1658,local_1660,in_stack_00000008,in_stack_00000010,
                 in_stack_00000018,(__m128i *)local_13a8,&local_13b8,thr_out,palVar21);
  bd_00 = (int)((ulong)palVar20 >> 0x20);
  highbd_filter_mask_dual
            (local_1350,local_1358,&local_13b8,(__m128i *)local_13a8,(__m128i *)&local_13f8);
  highbd_flat_mask4_dual_sse2
            ((__m128i *)
             CONCAT26(in_stack_ffffffffffffe876,
                      CONCAT24(in_stack_ffffffffffffe874,in_stack_ffffffffffffe870)),palVar21,
             thr_out,flat2_00,bd_00);
  local_11c8 = local_1408;
  uStack_11c0 = uStack_1400;
  local_11d8 = local_13f8;
  uStack_11d0 = uStack_13f0;
  local_1408 = local_1408 & local_13f8;
  uStack_1400 = uStack_1400 & uStack_13f0;
  local_11e8 = local_1418;
  uStack_11e0 = uStack_1410;
  local_1418 = local_1418 & local_1408;
  uStack_1410 = uStack_1410 & uStack_1400;
  local_11f8 = local_1408;
  uStack_11f0 = uStack_1400;
  highbd_filter4_dual_sse2
            (in_stack_ffffffffffffe918,in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
             in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,in_stack_ffffffffffffe8f0,
             in_stack_fffffffffffff210,in_stack_fffffffffffff218);
  palVar21 = local_1350;
  local_1168 = local_1408;
  uStack_1160 = uStack_1400;
  local_1178 = local_13e8;
  uStack_1170 = uStack_13e0;
  local_1168._0_2_ = (short)local_1408;
  local_1168._2_2_ = (short)(local_1408 >> 0x10);
  local_1168._4_2_ = (short)(local_1408 >> 0x20);
  local_1168._6_2_ = (short)(local_1408 >> 0x30);
  uStack_1160._0_2_ = (short)uStack_1400;
  uStack_1160._2_2_ = (short)(uStack_1400 >> 0x10);
  uStack_1160._4_2_ = (short)(uStack_1400 >> 0x20);
  uStack_1160._6_2_ = (short)(uStack_1400 >> 0x30);
  local_1178._0_2_ = (short)local_13e8;
  local_1178._2_2_ = (short)((ulong)local_13e8 >> 0x10);
  local_1178._4_2_ = (short)((ulong)local_13e8 >> 0x20);
  local_1178._6_2_ = (short)((ulong)local_13e8 >> 0x30);
  uStack_1170._0_2_ = (short)uStack_13e0;
  uStack_1170._2_2_ = (short)((ulong)uStack_13e0 >> 0x10);
  uStack_1170._4_2_ = (short)((ulong)uStack_13e0 >> 0x20);
  uStack_1170._6_2_ = (short)((ulong)uStack_13e0 >> 0x30);
  uStack_119a = -(ushort)(uStack_1160._6_2_ == uStack_1170._6_2_);
  local_11a8 = -(ushort)((short)local_1168 == (short)local_1178);
  sStack_11a6 = -(ushort)(local_1168._2_2_ == local_1178._2_2_);
  sStack_11a4 = -(ushort)(local_1168._4_2_ == local_1178._4_2_);
  sStack_11a2 = -(ushort)(local_1168._6_2_ == local_1178._6_2_);
  sStack_11a0 = -(ushort)((short)uStack_1160 == (short)uStack_1170);
  sStack_119e = -(ushort)(uStack_1160._2_2_ == uStack_1170._2_2_);
  sStack_119c = -(ushort)(uStack_1160._4_2_ == uStack_1170._4_2_);
  auVar9._2_2_ = -(ushort)(local_1168._2_2_ == local_1178._2_2_);
  auVar9._0_2_ = -(ushort)((short)local_1168 == (short)local_1178);
  auVar9._4_2_ = -(ushort)(local_1168._4_2_ == local_1178._4_2_);
  auVar9._6_2_ = -(ushort)(local_1168._6_2_ == local_1178._6_2_);
  auVar9._8_2_ = -(ushort)((short)uStack_1160 == (short)uStack_1170);
  auVar9._10_2_ = -(ushort)(uStack_1160._2_2_ == uStack_1170._2_2_);
  auVar9._12_2_ = -(ushort)(uStack_1160._4_2_ == uStack_1170._4_2_);
  auVar9._14_2_ = uStack_119a;
  if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uStack_119a >> 7) & 1) << 0xe | uStack_119a & 0x8000) == 0xffff) {
    (*local_1350)[0] = local_1438[0];
    (*palVar21)[1] = local_1438[1];
    palVar21 = local_1358;
    (*local_1358)[0] = local_1458;
    (*palVar21)[1] = uStack_1450;
    local_1350[1][0] = local_1438[2];
    local_1350[1][1] = local_1438[3];
    local_1358[1][0] = local_1448;
    local_1358[1][1] = lStack_1440;
  }
  else {
    local_114a = 8;
    local_1588 = 0x8000800080008;
    uStack_1580 = 0x8000800080008;
    local_114c = 4;
    local_1598 = 0x4000400040004;
    uStack_1590 = 0x4000400040004;
    lVar1 = local_1350[3][0];
    lVar2 = local_1350[3][1];
    lVar3 = local_1350[4][0];
    lVar4 = local_1350[4][1];
    lVar5 = local_1350[5][0];
    lVar6 = local_1350[5][1];
    local_658 = (short)lVar3;
    sStack_656 = (short)((ulong)lVar3 >> 0x10);
    sStack_654 = (short)((ulong)lVar3 >> 0x20);
    sStack_652 = (short)((ulong)lVar3 >> 0x30);
    sStack_650 = (short)lVar4;
    sStack_64e = (short)((ulong)lVar4 >> 0x10);
    sStack_64c = (short)((ulong)lVar4 >> 0x20);
    sStack_64a = (short)((ulong)lVar4 >> 0x30);
    local_668 = (short)lVar1;
    sStack_666 = (short)((ulong)lVar1 >> 0x10);
    sStack_664 = (short)((ulong)lVar1 >> 0x20);
    sStack_662 = (short)((ulong)lVar1 >> 0x30);
    sStack_660 = (short)lVar2;
    sStack_65e = (short)((ulong)lVar2 >> 0x10);
    sStack_65c = (short)((ulong)lVar2 >> 0x20);
    sStack_65a = (short)((ulong)lVar2 >> 0x30);
    local_678 = (short)lVar5;
    sStack_676 = (short)((ulong)lVar5 >> 0x10);
    sStack_674 = (short)((ulong)lVar5 >> 0x20);
    sStack_672 = (short)((ulong)lVar5 >> 0x30);
    sStack_670 = (short)lVar6;
    sStack_66e = (short)((ulong)lVar6 >> 0x10);
    sStack_66c = (short)((ulong)lVar6 >> 0x20);
    sStack_66a = (short)((ulong)lVar6 >> 0x30);
    lVar1 = local_1358[3][0];
    lVar2 = local_1358[3][1];
    lVar3 = local_1358[4][0];
    lVar4 = local_1358[4][1];
    lVar5 = local_1358[5][0];
    lVar6 = local_1358[5][1];
    local_698 = (short)lVar3;
    sStack_696 = (short)((ulong)lVar3 >> 0x10);
    sStack_694 = (short)((ulong)lVar3 >> 0x20);
    sStack_692 = (short)((ulong)lVar3 >> 0x30);
    sStack_690 = (short)lVar4;
    sStack_68e = (short)((ulong)lVar4 >> 0x10);
    sStack_68c = (short)((ulong)lVar4 >> 0x20);
    sStack_68a = (short)((ulong)lVar4 >> 0x30);
    local_6a8 = (short)lVar1;
    sStack_6a6 = (short)((ulong)lVar1 >> 0x10);
    sStack_6a4 = (short)((ulong)lVar1 >> 0x20);
    sStack_6a2 = (short)((ulong)lVar1 >> 0x30);
    sStack_6a0 = (short)lVar2;
    sStack_69e = (short)((ulong)lVar2 >> 0x10);
    sStack_69c = (short)((ulong)lVar2 >> 0x20);
    sStack_69a = (short)((ulong)lVar2 >> 0x30);
    local_6b8 = (short)lVar5;
    sStack_6b6 = (short)((ulong)lVar5 >> 0x10);
    sStack_6b4 = (short)((ulong)lVar5 >> 0x20);
    sStack_6b2 = (short)((ulong)lVar5 >> 0x30);
    sStack_6b0 = (short)lVar6;
    sStack_6ae = (short)((ulong)lVar6 >> 0x10);
    sStack_6ac = (short)((ulong)lVar6 >> 0x20);
    sStack_6aa = (short)((ulong)lVar6 >> 0x30);
    lVar1 = (*local_1350)[0];
    lVar2 = (*local_1350)[1];
    lVar3 = local_1350[1][0];
    lVar4 = local_1350[1][1];
    lVar5 = local_1350[2][0];
    lVar6 = local_1350[2][1];
    local_6d8 = (short)lVar5;
    sStack_6d6 = (short)((ulong)lVar5 >> 0x10);
    sStack_6d4 = (short)((ulong)lVar5 >> 0x20);
    sStack_6d2 = (short)((ulong)lVar5 >> 0x30);
    sStack_6d0 = (short)lVar6;
    sStack_6ce = (short)((ulong)lVar6 >> 0x10);
    sStack_6cc = (short)((ulong)lVar6 >> 0x20);
    sStack_6ca = (short)((ulong)lVar6 >> 0x30);
    local_6e8 = (short)lVar3;
    sStack_6e6 = (short)((ulong)lVar3 >> 0x10);
    sStack_6e4 = (short)((ulong)lVar3 >> 0x20);
    sStack_6e2 = (short)((ulong)lVar3 >> 0x30);
    sStack_6e0 = (short)lVar4;
    sStack_6de = (short)((ulong)lVar4 >> 0x10);
    sStack_6dc = (short)((ulong)lVar4 >> 0x20);
    sStack_6da = (short)((ulong)lVar4 >> 0x30);
    local_6f8 = (short)lVar1;
    sStack_6f6 = (short)((ulong)lVar1 >> 0x10);
    sStack_6f4 = (short)((ulong)lVar1 >> 0x20);
    sStack_6f2 = (short)((ulong)lVar1 >> 0x30);
    sStack_6f0 = (short)lVar2;
    sStack_6ee = (short)((ulong)lVar2 >> 0x10);
    sStack_6ec = (short)((ulong)lVar2 >> 0x20);
    sStack_6ea = (short)((ulong)lVar2 >> 0x30);
    local_6f8 = local_6f8 + local_6d8 + local_6e8;
    sStack_6f6 = sStack_6f6 + sStack_6d6 + sStack_6e6;
    sStack_6f4 = sStack_6f4 + sStack_6d4 + sStack_6e4;
    sStack_6f2 = sStack_6f2 + sStack_6d2 + sStack_6e2;
    sStack_6f0 = sStack_6f0 + sStack_6d0 + sStack_6e0;
    sStack_6ee = sStack_6ee + sStack_6ce + sStack_6de;
    sStack_6ec = sStack_6ec + sStack_6cc + sStack_6dc;
    sStack_6ea = sStack_6ea + sStack_6ca + sStack_6da;
    lVar1 = (*local_1358)[0];
    lVar2 = (*local_1358)[1];
    lVar3 = local_1358[1][0];
    lVar4 = local_1358[1][1];
    lVar5 = local_1358[2][0];
    lVar6 = local_1358[2][1];
    local_738 = (short)lVar5;
    sStack_736 = (short)((ulong)lVar5 >> 0x10);
    sStack_734 = (short)((ulong)lVar5 >> 0x20);
    sStack_732 = (short)((ulong)lVar5 >> 0x30);
    sStack_730 = (short)lVar6;
    sStack_72e = (short)((ulong)lVar6 >> 0x10);
    sStack_72c = (short)((ulong)lVar6 >> 0x20);
    sStack_72a = (short)((ulong)lVar6 >> 0x30);
    local_748 = (short)lVar3;
    sStack_746 = (short)((ulong)lVar3 >> 0x10);
    sStack_744 = (short)((ulong)lVar3 >> 0x20);
    sStack_742 = (short)((ulong)lVar3 >> 0x30);
    sStack_740 = (short)lVar4;
    sStack_73e = (short)((ulong)lVar4 >> 0x10);
    sStack_73c = (short)((ulong)lVar4 >> 0x20);
    sStack_73a = (short)((ulong)lVar4 >> 0x30);
    local_758 = (short)lVar1;
    sStack_756 = (short)((ulong)lVar1 >> 0x10);
    sStack_754 = (short)((ulong)lVar1 >> 0x20);
    sStack_752 = (short)((ulong)lVar1 >> 0x30);
    sStack_750 = (short)lVar2;
    sStack_74e = (short)((ulong)lVar2 >> 0x10);
    sStack_74c = (short)((ulong)lVar2 >> 0x20);
    sStack_74a = (short)((ulong)lVar2 >> 0x30);
    local_758 = local_758 + local_738 + local_748;
    sStack_756 = sStack_756 + sStack_736 + sStack_746;
    sStack_754 = sStack_754 + sStack_734 + sStack_744;
    sStack_752 = sStack_752 + sStack_732 + sStack_742;
    sStack_750 = sStack_750 + sStack_730 + sStack_740;
    sStack_74e = sStack_74e + sStack_72e + sStack_73e;
    sStack_74c = sStack_74c + sStack_72c + sStack_73c;
    sStack_74a = sStack_74a + sStack_72a + sStack_73a;
    local_15a8 = local_678 + local_658 + local_668 + local_6f8 +
                 local_6b8 + local_698 + local_6a8 + local_758 + 8;
    sStack_15a6 = sStack_676 + sStack_656 + sStack_666 + sStack_6f6 +
                  sStack_6b6 + sStack_696 + sStack_6a6 + sStack_756 + 8;
    sStack_15a4 = sStack_674 + sStack_654 + sStack_664 + sStack_6f4 +
                  sStack_6b4 + sStack_694 + sStack_6a4 + sStack_754 + 8;
    sStack_15a2 = sStack_672 + sStack_652 + sStack_662 + sStack_6f2 +
                  sStack_6b2 + sStack_692 + sStack_6a2 + sStack_752 + 8;
    sStack_15a0 = sStack_670 + sStack_650 + sStack_660 + sStack_6f0 +
                  sStack_6b0 + sStack_690 + sStack_6a0 + sStack_750 + 8;
    sStack_159e = sStack_66e + sStack_64e + sStack_65e + sStack_6ee +
                  sStack_6ae + sStack_68e + sStack_69e + sStack_74e + 8;
    sStack_159c = sStack_66c + sStack_64c + sStack_65c + sStack_6ec +
                  sStack_6ac + sStack_68c + sStack_69c + sStack_74c + 8;
    sStack_159a = sStack_66a + sStack_64a + sStack_65a + sStack_6ea +
                  sStack_6aa + sStack_68a + sStack_69a + sStack_74a + 8;
    sVar11 = local_6f8 + local_758 + 4;
    sVar12 = sStack_6f6 + sStack_756 + 4;
    sVar13 = sStack_6f4 + sStack_754 + 4;
    sVar14 = sStack_6f2 + sStack_752 + 4;
    sVar15 = sStack_6f0 + sStack_750 + 4;
    sVar17 = sStack_6ee + sStack_74e + 4;
    sVar18 = sStack_6ec + sStack_74c + 4;
    sVar19 = sStack_6ea + sStack_74a + 4;
    lVar1 = (*local_1350)[0];
    lVar2 = (*local_1350)[1];
    lVar3 = local_1350[3][0];
    lVar4 = local_1350[3][1];
    local_818 = (short)lVar3;
    sStack_816 = (short)((ulong)lVar3 >> 0x10);
    sStack_814 = (short)((ulong)lVar3 >> 0x20);
    sStack_812 = (short)((ulong)lVar3 >> 0x30);
    sStack_810 = (short)lVar4;
    sStack_80e = (short)((ulong)lVar4 >> 0x10);
    sStack_80c = (short)((ulong)lVar4 >> 0x20);
    sStack_80a = (short)((ulong)lVar4 >> 0x30);
    local_828 = (short)lVar1;
    sStack_826 = (short)((ulong)lVar1 >> 0x10);
    sStack_824 = (short)((ulong)lVar1 >> 0x20);
    sStack_822 = (short)((ulong)lVar1 >> 0x30);
    sStack_820 = (short)lVar2;
    sStack_81e = (short)((ulong)lVar2 >> 0x10);
    sStack_81c = (short)((ulong)lVar2 >> 0x20);
    sStack_81a = (short)((ulong)lVar2 >> 0x30);
    local_1488 = (ushort)(sVar11 + local_818 + local_828) >> 3;
    uStack_1486 = (ushort)(sVar12 + sStack_816 + sStack_826) >> 3;
    uStack_1484 = (ushort)(sVar13 + sStack_814 + sStack_824) >> 3;
    uStack_1482 = (ushort)(sVar14 + sStack_812 + sStack_822) >> 3;
    uStack_1480 = (ushort)(sVar15 + sStack_810 + sStack_820) >> 3;
    uStack_147e = (ushort)(sVar17 + sStack_80e + sStack_81e) >> 3;
    uStack_147c = (ushort)(sVar18 + sStack_80c + sStack_81c) >> 3;
    uStack_147a = (ushort)(sVar19 + sStack_80a + sStack_81a) >> 3;
    lVar1 = (*local_1358)[0];
    lVar2 = (*local_1358)[1];
    lVar3 = local_1358[3][0];
    lVar4 = local_1358[3][1];
    local_858 = (short)lVar3;
    sStack_856 = (short)((ulong)lVar3 >> 0x10);
    sStack_854 = (short)((ulong)lVar3 >> 0x20);
    sStack_852 = (short)((ulong)lVar3 >> 0x30);
    sStack_850 = (short)lVar4;
    sStack_84e = (short)((ulong)lVar4 >> 0x10);
    sStack_84c = (short)((ulong)lVar4 >> 0x20);
    sStack_84a = (short)((ulong)lVar4 >> 0x30);
    local_868 = (short)lVar1;
    sStack_866 = (short)((ulong)lVar1 >> 0x10);
    sStack_864 = (short)((ulong)lVar1 >> 0x20);
    sStack_862 = (short)((ulong)lVar1 >> 0x30);
    sStack_860 = (short)lVar2;
    sStack_85e = (short)((ulong)lVar2 >> 0x10);
    sStack_85c = (short)((ulong)lVar2 >> 0x20);
    sStack_85a = (short)((ulong)lVar2 >> 0x30);
    local_14b8 = (ushort)(sVar11 + local_858 + local_868) >> 3;
    uStack_14b6 = (ushort)(sVar12 + sStack_856 + sStack_866) >> 3;
    uStack_14b4 = (ushort)(sVar13 + sStack_854 + sStack_864) >> 3;
    uStack_14b2 = (ushort)(sVar14 + sStack_852 + sStack_862) >> 3;
    uStack_14b0 = (ushort)(sVar15 + sStack_850 + sStack_860) >> 3;
    uStack_14ae = (ushort)(sVar17 + sStack_84e + sStack_85e) >> 3;
    uStack_14ac = (ushort)(sVar18 + sStack_84c + sStack_85c) >> 3;
    uStack_14aa = (ushort)(sVar19 + sStack_84a + sStack_85a) >> 3;
    lVar1 = local_1350[6][0];
    lVar2 = local_1350[6][1];
    local_898 = (short)lVar1;
    sStack_896 = (short)((ulong)lVar1 >> 0x10);
    sStack_894 = (short)((ulong)lVar1 >> 0x20);
    sStack_892 = (short)((ulong)lVar1 >> 0x30);
    sStack_890 = (short)lVar2;
    sStack_88e = (short)((ulong)lVar2 >> 0x10);
    sStack_88c = (short)((ulong)lVar2 >> 0x20);
    sStack_88a = (short)((ulong)lVar2 >> 0x30);
    local_15e8 = local_898 * 2;
    sStack_15e6 = sStack_896 * 2;
    sStack_15e4 = sStack_894 * 2;
    sStack_15e2 = sStack_892 * 2;
    sStack_15e0 = sStack_890 * 2;
    sStack_15de = sStack_88e * 2;
    sStack_15dc = sStack_88c * 2;
    sStack_15da = sStack_88a * 2;
    lVar1 = local_1358[6][0];
    lVar2 = local_1358[6][1];
    local_8b8 = (short)lVar1;
    sStack_8b6 = (short)((ulong)lVar1 >> 0x10);
    sStack_8b4 = (short)((ulong)lVar1 >> 0x20);
    sStack_8b2 = (short)((ulong)lVar1 >> 0x30);
    sStack_8b0 = (short)lVar2;
    sStack_8ae = (short)((ulong)lVar2 >> 0x10);
    sStack_8ac = (short)((ulong)lVar2 >> 0x20);
    sStack_8aa = (short)((ulong)lVar2 >> 0x30);
    local_15f8 = local_8b8 * 2;
    sStack_15f6 = sStack_8b6 * 2;
    sStack_15f4 = sStack_8b4 * 2;
    sStack_15f2 = sStack_8b2 * 2;
    sStack_15f0 = sStack_8b0 * 2;
    sStack_15ee = sStack_8ae * 2;
    sStack_15ec = sStack_8ac * 2;
    sStack_15ea = sStack_8aa * 2;
    lVar1 = local_1350[3][0];
    lVar2 = local_1350[3][1];
    local_8d8 = (short)lVar1;
    sStack_8d6 = (short)((ulong)lVar1 >> 0x10);
    sStack_8d4 = (short)((ulong)lVar1 >> 0x20);
    sStack_8d2 = (short)((ulong)lVar1 >> 0x30);
    sStack_8d0 = (short)lVar2;
    sStack_8ce = (short)((ulong)lVar2 >> 0x10);
    sStack_8cc = (short)((ulong)lVar2 >> 0x20);
    sStack_8ca = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_1358[3][0];
    lVar2 = local_1358[3][1];
    local_8f8 = (short)lVar1;
    sStack_8f6 = (short)((ulong)lVar1 >> 0x10);
    sStack_8f4 = (short)((ulong)lVar1 >> 0x20);
    sStack_8f2 = (short)((ulong)lVar1 >> 0x30);
    sStack_8f0 = (short)lVar2;
    sStack_8ee = (short)((ulong)lVar2 >> 0x10);
    sStack_8ec = (short)((ulong)lVar2 >> 0x20);
    sStack_8ea = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_1350[5][0];
    lVar2 = local_1350[5][1];
    local_4a8 = (short)lVar1;
    sStack_4a6 = (short)((ulong)lVar1 >> 0x10);
    sStack_4a4 = (short)((ulong)lVar1 >> 0x20);
    sStack_4a2 = (short)((ulong)lVar1 >> 0x30);
    sStack_4a0 = (short)lVar2;
    sStack_49e = (short)((ulong)lVar2 >> 0x10);
    sStack_49c = (short)((ulong)lVar2 >> 0x20);
    sStack_49a = (short)((ulong)lVar2 >> 0x30);
    local_15b8 = local_15a8 - local_4a8;
    sStack_15b6 = sStack_15a6 - sStack_4a6;
    sStack_15b4 = sStack_15a4 - sStack_4a4;
    sStack_15b2 = sStack_15a2 - sStack_4a2;
    sStack_15b0 = sStack_15a0 - sStack_4a0;
    sStack_15ae = sStack_159e - sStack_49e;
    sStack_15ac = sStack_159c - sStack_49c;
    sStack_15aa = sStack_159a - sStack_49a;
    lVar1 = local_1358[5][0];
    lVar2 = local_1358[5][1];
    local_4c8 = (short)lVar1;
    sStack_4c6 = (short)((ulong)lVar1 >> 0x10);
    sStack_4c4 = (short)((ulong)lVar1 >> 0x20);
    sStack_4c2 = (short)((ulong)lVar1 >> 0x30);
    sStack_4c0 = (short)lVar2;
    sStack_4be = (short)((ulong)lVar2 >> 0x10);
    sStack_4bc = (short)((ulong)lVar2 >> 0x20);
    sStack_4ba = (short)((ulong)lVar2 >> 0x30);
    local_1628 = local_15a8 - local_4c8;
    sStack_1626 = sStack_15a6 - sStack_4c6;
    sStack_1624 = sStack_15a4 - sStack_4c4;
    sStack_1622 = sStack_15a2 - sStack_4c2;
    sStack_1620 = sStack_15a0 - sStack_4c0;
    sStack_161e = sStack_159e - sStack_4be;
    sStack_161c = sStack_159c - sStack_4bc;
    sStack_161a = sStack_159a - sStack_4ba;
    lVar1 = local_1350[2][0];
    lVar2 = local_1350[2][1];
    local_4e8 = (short)lVar1;
    sStack_4e6 = (short)((ulong)lVar1 >> 0x10);
    sStack_4e4 = (short)((ulong)lVar1 >> 0x20);
    sStack_4e2 = (short)((ulong)lVar1 >> 0x30);
    sStack_4e0 = (short)lVar2;
    sStack_4de = (short)((ulong)lVar2 >> 0x10);
    sStack_4dc = (short)((ulong)lVar2 >> 0x20);
    sStack_4da = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_1358[2][0];
    lVar2 = local_1358[2][1];
    local_508 = (short)lVar1;
    sStack_506 = (short)((ulong)lVar1 >> 0x10);
    sStack_504 = (short)((ulong)lVar1 >> 0x20);
    sStack_502 = (short)((ulong)lVar1 >> 0x30);
    sStack_500 = (short)lVar2;
    sStack_4fe = (short)((ulong)lVar2 >> 0x10);
    sStack_4fc = (short)((ulong)lVar2 >> 0x20);
    sStack_4fa = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_1350[1][0];
    lVar2 = local_1350[1][1];
    local_928 = (short)lVar1;
    sStack_926 = (short)((ulong)lVar1 >> 0x10);
    sStack_924 = (short)((ulong)lVar1 >> 0x20);
    sStack_922 = (short)((ulong)lVar1 >> 0x30);
    sStack_920 = (short)lVar2;
    sStack_91e = (short)((ulong)lVar2 >> 0x10);
    sStack_91c = (short)((ulong)lVar2 >> 0x20);
    sStack_91a = (short)((ulong)lVar2 >> 0x30);
    local_1478 = (ushort)((sVar11 - local_508) + local_8d8 * 2 + local_928) >> 3;
    uStack_1476 = (ushort)((sVar12 - sStack_506) + sStack_8d6 * 2 + sStack_926) >> 3;
    uStack_1474 = (ushort)((sVar13 - sStack_504) + sStack_8d4 * 2 + sStack_924) >> 3;
    uStack_1472 = (ushort)((sVar14 - sStack_502) + sStack_8d2 * 2 + sStack_922) >> 3;
    uStack_1470 = (ushort)((sVar15 - sStack_500) + sStack_8d0 * 2 + sStack_920) >> 3;
    uStack_146e = (ushort)((sVar17 - sStack_4fe) + sStack_8ce * 2 + sStack_91e) >> 3;
    uStack_146c = (ushort)((sVar18 - sStack_4fc) + sStack_8cc * 2 + sStack_91c) >> 3;
    uStack_146a = (ushort)((sVar19 - sStack_4fa) + sStack_8ca * 2 + sStack_91a) >> 3;
    lVar1 = local_1358[1][0];
    lVar2 = local_1358[1][1];
    local_968 = (short)lVar1;
    sStack_966 = (short)((ulong)lVar1 >> 0x10);
    sStack_964 = (short)((ulong)lVar1 >> 0x20);
    sStack_962 = (short)((ulong)lVar1 >> 0x30);
    sStack_960 = (short)lVar2;
    sStack_95e = (short)((ulong)lVar2 >> 0x10);
    sStack_95c = (short)((ulong)lVar2 >> 0x20);
    sStack_95a = (short)((ulong)lVar2 >> 0x30);
    local_14a8 = (ushort)((sVar11 - local_4e8) + local_8f8 * 2 + local_968) >> 3;
    uStack_14a6 = (ushort)((sVar12 - sStack_4e6) + sStack_8f6 * 2 + sStack_966) >> 3;
    uStack_14a4 = (ushort)((sVar13 - sStack_4e4) + sStack_8f4 * 2 + sStack_964) >> 3;
    uStack_14a2 = (ushort)((sVar14 - sStack_4e2) + sStack_8f2 * 2 + sStack_962) >> 3;
    uStack_14a0 = (ushort)((sVar15 - sStack_4e0) + sStack_8f0 * 2 + sStack_960) >> 3;
    uStack_149e = (ushort)((sVar17 - sStack_4de) + sStack_8ee * 2 + sStack_95e) >> 3;
    uStack_149c = (ushort)((sVar18 - sStack_4dc) + sStack_8ec * 2 + sStack_95c) >> 3;
    uStack_149a = (ushort)((sVar19 - sStack_4da) + sStack_8ea * 2 + sStack_95a) >> 3;
    lVar1 = local_1358[1][0];
    lVar2 = local_1358[1][1];
    local_528 = (short)lVar1;
    sStack_526 = (short)((ulong)lVar1 >> 0x10);
    sStack_524 = (short)((ulong)lVar1 >> 0x20);
    sStack_522 = (short)((ulong)lVar1 >> 0x30);
    sStack_520 = (short)lVar2;
    sStack_51e = (short)((ulong)lVar2 >> 0x10);
    sStack_51c = (short)((ulong)lVar2 >> 0x20);
    sStack_51a = (short)((ulong)lVar2 >> 0x30);
    local_15c8 = (sVar11 - local_508) - local_528;
    sStack_15c6 = (sVar12 - sStack_506) - sStack_526;
    sStack_15c4 = (sVar13 - sStack_504) - sStack_524;
    sStack_15c2 = (sVar14 - sStack_502) - sStack_522;
    sStack_15c0 = (sVar15 - sStack_500) - sStack_520;
    sStack_15be = (sVar17 - sStack_4fe) - sStack_51e;
    sStack_15bc = (sVar18 - sStack_4fc) - sStack_51c;
    sStack_15ba = (sVar19 - sStack_4fa) - sStack_51a;
    lVar1 = local_1350[1][0];
    lVar2 = local_1350[1][1];
    local_548 = (short)lVar1;
    sStack_546 = (short)((ulong)lVar1 >> 0x10);
    sStack_544 = (short)((ulong)lVar1 >> 0x20);
    sStack_542 = (short)((ulong)lVar1 >> 0x30);
    sStack_540 = (short)lVar2;
    sStack_53e = (short)((ulong)lVar2 >> 0x10);
    sStack_53c = (short)((ulong)lVar2 >> 0x20);
    sStack_53a = (short)((ulong)lVar2 >> 0x30);
    local_15d8 = (sVar11 - local_4e8) - local_548;
    sStack_15d6 = (sVar12 - sStack_4e6) - sStack_546;
    sStack_15d4 = (sVar13 - sStack_4e4) - sStack_544;
    sStack_15d2 = (sVar14 - sStack_4e2) - sStack_542;
    sStack_15d0 = (sVar15 - sStack_4e0) - sStack_540;
    sStack_15ce = (sVar17 - sStack_4de) - sStack_53e;
    sStack_15cc = (sVar18 - sStack_4dc) - sStack_53c;
    sStack_15ca = (sVar19 - sStack_4da) - sStack_53a;
    lVar1 = local_1350[3][0];
    lVar2 = local_1350[3][1];
    local_9a8 = (short)lVar1;
    sStack_9a6 = (short)((ulong)lVar1 >> 0x10);
    sStack_9a4 = (short)((ulong)lVar1 >> 0x20);
    sStack_9a2 = (short)((ulong)lVar1 >> 0x30);
    sStack_9a0 = (short)lVar2;
    sStack_99e = (short)((ulong)lVar2 >> 0x10);
    sStack_99c = (short)((ulong)lVar2 >> 0x20);
    sStack_99a = (short)((ulong)lVar2 >> 0x30);
    local_1608 = local_8d8 * 2 + local_9a8;
    sStack_1606 = sStack_8d6 * 2 + sStack_9a6;
    sStack_1604 = sStack_8d4 * 2 + sStack_9a4;
    sStack_1602 = sStack_8d2 * 2 + sStack_9a2;
    sStack_1600 = sStack_8d0 * 2 + sStack_9a0;
    sStack_15fe = sStack_8ce * 2 + sStack_99e;
    sStack_15fc = sStack_8cc * 2 + sStack_99c;
    sStack_15fa = sStack_8ca * 2 + sStack_99a;
    lVar1 = local_1358[3][0];
    lVar2 = local_1358[3][1];
    local_9c8 = (short)lVar1;
    sStack_9c6 = (short)((ulong)lVar1 >> 0x10);
    sStack_9c4 = (short)((ulong)lVar1 >> 0x20);
    sStack_9c2 = (short)((ulong)lVar1 >> 0x30);
    sStack_9c0 = (short)lVar2;
    sStack_9be = (short)((ulong)lVar2 >> 0x10);
    sStack_9bc = (short)((ulong)lVar2 >> 0x20);
    sStack_9ba = (short)((ulong)lVar2 >> 0x30);
    local_1618 = local_8f8 * 2 + local_9c8;
    sStack_1616 = sStack_8f6 * 2 + sStack_9c6;
    sStack_1614 = sStack_8f4 * 2 + sStack_9c4;
    sStack_1612 = sStack_8f2 * 2 + sStack_9c2;
    sStack_1610 = sStack_8f0 * 2 + sStack_9c0;
    sStack_160e = sStack_8ee * 2 + sStack_9be;
    sStack_160c = sStack_8ec * 2 + sStack_9bc;
    sStack_160a = sStack_8ea * 2 + sStack_9ba;
    lVar1 = local_1350[2][0];
    lVar2 = local_1350[2][1];
    local_9e8 = (short)lVar1;
    sStack_9e6 = (short)((ulong)lVar1 >> 0x10);
    sStack_9e4 = (short)((ulong)lVar1 >> 0x20);
    sStack_9e2 = (short)((ulong)lVar1 >> 0x30);
    sStack_9e0 = (short)lVar2;
    sStack_9de = (short)((ulong)lVar2 >> 0x10);
    sStack_9dc = (short)((ulong)lVar2 >> 0x20);
    sStack_9da = (short)((ulong)lVar2 >> 0x30);
    local_1468 = CONCAT26((ushort)(sStack_15c2 + sStack_1602 + sStack_9e2) >> 3,
                          CONCAT24((ushort)(sStack_15c4 + sStack_1604 + sStack_9e4) >> 3,
                                   CONCAT22((ushort)(sStack_15c6 + sStack_1606 + sStack_9e6) >> 3,
                                            (ushort)(local_15c8 + local_1608 + local_9e8) >> 3)));
    uStack_1460 = CONCAT26((ushort)(sStack_15ba + sStack_15fa + sStack_9da) >> 3,
                           CONCAT24((ushort)(sStack_15bc + sStack_15fc + sStack_9dc) >> 3,
                                    CONCAT22((ushort)(sStack_15be + sStack_15fe + sStack_9de) >> 3,
                                             (ushort)(sStack_15c0 + sStack_1600 + sStack_9e0) >> 3))
                          );
    lVar1 = local_1358[2][0];
    lVar2 = local_1358[2][1];
    local_a28 = (short)lVar1;
    sStack_a26 = (short)((ulong)lVar1 >> 0x10);
    sStack_a24 = (short)((ulong)lVar1 >> 0x20);
    sStack_a22 = (short)((ulong)lVar1 >> 0x30);
    sStack_a20 = (short)lVar2;
    sStack_a1e = (short)((ulong)lVar2 >> 0x10);
    sStack_a1c = (short)((ulong)lVar2 >> 0x20);
    sStack_a1a = (short)((ulong)lVar2 >> 0x30);
    local_1498 = CONCAT26((ushort)(sStack_15d2 + sStack_1612 + sStack_a22) >> 3,
                          CONCAT24((ushort)(sStack_15d4 + sStack_1614 + sStack_a24) >> 3,
                                   CONCAT22((ushort)(sStack_15d6 + sStack_1616 + sStack_a26) >> 3,
                                            (ushort)(local_15d8 + local_1618 + local_a28) >> 3)));
    uStack_1490 = CONCAT26((ushort)(sStack_15ca + sStack_160a + sStack_a1a) >> 3,
                           CONCAT24((ushort)(sStack_15cc + sStack_160c + sStack_a1c) >> 3,
                                    CONCAT22((ushort)(sStack_15ce + sStack_160e + sStack_a1e) >> 3,
                                             (ushort)(sStack_15d0 + sStack_1610 + sStack_a20) >> 3))
                          );
    local_1188 = local_1418;
    uStack_1180 = uStack_1410;
    local_1198 = local_13e8;
    uStack_1190 = uStack_13e0;
    local_1188._0_2_ = (short)local_1418;
    local_1188._2_2_ = (short)(local_1418 >> 0x10);
    local_1188._4_2_ = (short)(local_1418 >> 0x20);
    local_1188._6_2_ = (short)(local_1418 >> 0x30);
    uStack_1180._0_2_ = (short)uStack_1410;
    uStack_1180._2_2_ = (short)(uStack_1410 >> 0x10);
    uStack_1180._4_2_ = (short)(uStack_1410 >> 0x20);
    uStack_1180._6_2_ = (short)(uStack_1410 >> 0x30);
    uStack_11aa = -(ushort)(uStack_1180._6_2_ == uStack_1170._6_2_);
    local_11b8 = -(ushort)((short)local_1188 == (short)local_1178);
    sStack_11b6 = -(ushort)(local_1188._2_2_ == local_1178._2_2_);
    sStack_11b4 = -(ushort)(local_1188._4_2_ == local_1178._4_2_);
    sStack_11b2 = -(ushort)(local_1188._6_2_ == local_1178._6_2_);
    sStack_11b0 = -(ushort)((short)uStack_1180 == (short)uStack_1170);
    sStack_11ae = -(ushort)(uStack_1180._2_2_ == uStack_1170._2_2_);
    sStack_11ac = -(ushort)(uStack_1180._4_2_ == uStack_1170._4_2_);
    auVar8._2_2_ = -(ushort)(local_1188._2_2_ == local_1178._2_2_);
    auVar8._0_2_ = -(ushort)((short)local_1188 == (short)local_1178);
    auVar8._4_2_ = -(ushort)(local_1188._4_2_ == local_1178._4_2_);
    auVar8._6_2_ = -(ushort)(local_1188._6_2_ == local_1178._6_2_);
    auVar8._8_2_ = -(ushort)((short)uStack_1180 == (short)uStack_1170);
    auVar8._10_2_ = -(ushort)(uStack_1180._2_2_ == uStack_1170._2_2_);
    auVar8._12_2_ = -(ushort)(uStack_1180._4_2_ == uStack_1170._4_2_);
    auVar8._14_2_ = uStack_11aa;
    local_162c = (uint)((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(uStack_11aa >> 7) & 1) << 0xe |
                                uStack_11aa & 0x8000) != 0xffff);
    if (local_162c != 0) {
      lVar1 = local_1350[6][0];
      lVar2 = local_1350[6][1];
      lVar3 = (*local_1350)[0];
      lVar4 = (*local_1350)[1];
      local_a58 = (short)lVar1;
      sStack_a56 = (short)((ulong)lVar1 >> 0x10);
      sStack_a54 = (short)((ulong)lVar1 >> 0x20);
      sStack_a52 = (short)((ulong)lVar1 >> 0x30);
      sStack_a50 = (short)lVar2;
      sStack_a4e = (short)((ulong)lVar2 >> 0x10);
      sStack_a4c = (short)((ulong)lVar2 >> 0x20);
      sStack_a4a = (short)((ulong)lVar2 >> 0x30);
      local_a68 = (short)lVar3;
      sStack_a66 = (short)((ulong)lVar3 >> 0x10);
      sStack_a64 = (short)((ulong)lVar3 >> 0x20);
      sStack_a62 = (short)((ulong)lVar3 >> 0x30);
      sStack_a60 = (short)lVar4;
      sStack_a5e = (short)((ulong)lVar4 >> 0x10);
      sStack_a5c = (short)((ulong)lVar4 >> 0x20);
      sStack_a5a = (short)((ulong)lVar4 >> 0x30);
      lVar1 = local_1350[1][0];
      lVar2 = local_1350[1][1];
      lVar3 = (*local_1358)[0];
      lVar4 = (*local_1358)[1];
      local_a78 = (short)lVar1;
      sStack_a76 = (short)((ulong)lVar1 >> 0x10);
      sStack_a74 = (short)((ulong)lVar1 >> 0x20);
      sStack_a72 = (short)((ulong)lVar1 >> 0x30);
      sStack_a70 = (short)lVar2;
      sStack_a6e = (short)((ulong)lVar2 >> 0x10);
      sStack_a6c = (short)((ulong)lVar2 >> 0x20);
      sStack_a6a = (short)((ulong)lVar2 >> 0x30);
      local_a88 = (short)lVar3;
      sStack_a86 = (short)((ulong)lVar3 >> 0x10);
      sStack_a84 = (short)((ulong)lVar3 >> 0x20);
      sStack_a82 = (short)((ulong)lVar3 >> 0x30);
      sStack_a80 = (short)lVar4;
      sStack_a7e = (short)((ulong)lVar4 >> 0x10);
      sStack_a7c = (short)((ulong)lVar4 >> 0x20);
      sStack_a7a = (short)((ulong)lVar4 >> 0x30);
      local_1518._0_2_ = (ushort)(local_15a8 + local_a58 + local_a68 + local_a78 + local_a88) >> 4;
      local_1518._2_2_ =
           (ushort)(sStack_15a6 + sStack_a56 + sStack_a66 + sStack_a76 + sStack_a86) >> 4;
      local_1518._4_2_ =
           (ushort)(sStack_15a4 + sStack_a54 + sStack_a64 + sStack_a74 + sStack_a84) >> 4;
      local_1518._6_2_ =
           (ushort)(sStack_15a2 + sStack_a52 + sStack_a62 + sStack_a72 + sStack_a82) >> 4;
      uStack_1510._0_2_ =
           (ushort)(sStack_15a0 + sStack_a50 + sStack_a60 + sStack_a70 + sStack_a80) >> 4;
      uStack_1510._2_2_ =
           (ushort)(sStack_159e + sStack_a4e + sStack_a5e + sStack_a6e + sStack_a7e) >> 4;
      uStack_1510._4_2_ =
           (ushort)(sStack_159c + sStack_a4c + sStack_a5c + sStack_a6c + sStack_a7c) >> 4;
      uStack_1510._6_2_ =
           (ushort)(sStack_159a + sStack_a4a + sStack_a5a + sStack_a6a + sStack_a7a) >> 4;
      lVar1 = local_1358[6][0];
      lVar2 = local_1358[6][1];
      lVar3 = (*local_1358)[0];
      lVar4 = (*local_1358)[1];
      local_ad8 = (short)lVar1;
      sStack_ad6 = (short)((ulong)lVar1 >> 0x10);
      sStack_ad4 = (short)((ulong)lVar1 >> 0x20);
      sStack_ad2 = (short)((ulong)lVar1 >> 0x30);
      sStack_ad0 = (short)lVar2;
      sStack_ace = (short)((ulong)lVar2 >> 0x10);
      sStack_acc = (short)((ulong)lVar2 >> 0x20);
      sStack_aca = (short)((ulong)lVar2 >> 0x30);
      local_ae8 = (short)lVar3;
      sStack_ae6 = (short)((ulong)lVar3 >> 0x10);
      sStack_ae4 = (short)((ulong)lVar3 >> 0x20);
      sStack_ae2 = (short)((ulong)lVar3 >> 0x30);
      sStack_ae0 = (short)lVar4;
      sStack_ade = (short)((ulong)lVar4 >> 0x10);
      sStack_adc = (short)((ulong)lVar4 >> 0x20);
      sStack_ada = (short)((ulong)lVar4 >> 0x30);
      lVar1 = (*local_1350)[0];
      lVar2 = (*local_1350)[1];
      lVar3 = local_1358[1][0];
      lVar4 = local_1358[1][1];
      local_af8 = (short)lVar1;
      sStack_af6 = (short)((ulong)lVar1 >> 0x10);
      sStack_af4 = (short)((ulong)lVar1 >> 0x20);
      sStack_af2 = (short)((ulong)lVar1 >> 0x30);
      sStack_af0 = (short)lVar2;
      sStack_aee = (short)((ulong)lVar2 >> 0x10);
      sStack_aec = (short)((ulong)lVar2 >> 0x20);
      sStack_aea = (short)((ulong)lVar2 >> 0x30);
      local_b08 = (short)lVar3;
      sStack_b06 = (short)((ulong)lVar3 >> 0x10);
      sStack_b04 = (short)((ulong)lVar3 >> 0x20);
      sStack_b02 = (short)((ulong)lVar3 >> 0x30);
      sStack_b00 = (short)lVar4;
      sStack_afe = (short)((ulong)lVar4 >> 0x10);
      sStack_afc = (short)((ulong)lVar4 >> 0x20);
      sStack_afa = (short)((ulong)lVar4 >> 0x30);
      local_1578._0_2_ = (ushort)(local_15a8 + local_ad8 + local_ae8 + local_af8 + local_b08) >> 4;
      local_1578._2_2_ =
           (ushort)(sStack_15a6 + sStack_ad6 + sStack_ae6 + sStack_af6 + sStack_b06) >> 4;
      local_1578._4_2_ =
           (ushort)(sStack_15a4 + sStack_ad4 + sStack_ae4 + sStack_af4 + sStack_b04) >> 4;
      local_1578._6_2_ =
           (ushort)(sStack_15a2 + sStack_ad2 + sStack_ae2 + sStack_af2 + sStack_b02) >> 4;
      uStack_1570._0_2_ =
           (ushort)(sStack_15a0 + sStack_ad0 + sStack_ae0 + sStack_af0 + sStack_b00) >> 4;
      uStack_1570._2_2_ =
           (ushort)(sStack_159e + sStack_ace + sStack_ade + sStack_aee + sStack_afe) >> 4;
      uStack_1570._4_2_ =
           (ushort)(sStack_159c + sStack_acc + sStack_adc + sStack_aec + sStack_afc) >> 4;
      uStack_1570._6_2_ =
           (ushort)(sStack_159a + sStack_aca + sStack_ada + sStack_aea + sStack_afa) >> 4;
      lVar1 = local_1350[1][0];
      lVar2 = local_1350[1][1];
      lVar3 = local_1350[2][0];
      lVar4 = local_1350[2][1];
      lVar5 = (*local_1350)[0];
      lVar6 = (*local_1350)[1];
      local_b58 = (short)lVar3;
      sStack_b56 = (short)((ulong)lVar3 >> 0x10);
      sStack_b54 = (short)((ulong)lVar3 >> 0x20);
      sStack_b52 = (short)((ulong)lVar3 >> 0x30);
      sStack_b50 = (short)lVar4;
      sStack_b4e = (short)((ulong)lVar4 >> 0x10);
      sStack_b4c = (short)((ulong)lVar4 >> 0x20);
      sStack_b4a = (short)((ulong)lVar4 >> 0x30);
      local_b68 = (short)lVar5;
      sStack_b66 = (short)((ulong)lVar5 >> 0x10);
      sStack_b64 = (short)((ulong)lVar5 >> 0x20);
      sStack_b62 = (short)((ulong)lVar5 >> 0x30);
      sStack_b60 = (short)lVar6;
      sStack_b5e = (short)((ulong)lVar6 >> 0x10);
      sStack_b5c = (short)((ulong)lVar6 >> 0x20);
      sStack_b5a = (short)((ulong)lVar6 >> 0x30);
      local_b78 = (short)lVar1;
      sStack_b76 = (short)((ulong)lVar1 >> 0x10);
      sStack_b74 = (short)((ulong)lVar1 >> 0x20);
      sStack_b72 = (short)((ulong)lVar1 >> 0x30);
      sStack_b70 = (short)lVar2;
      sStack_b6e = (short)((ulong)lVar2 >> 0x10);
      sStack_b6c = (short)((ulong)lVar2 >> 0x20);
      sStack_b6a = (short)((ulong)lVar2 >> 0x30);
      local_1508 = (ushort)(local_1628 + local_15e8 + local_b78 + local_b58 + local_b68) >> 4;
      uStack_1506 = (ushort)(sStack_1626 + sStack_15e6 + sStack_b76 + sStack_b56 + sStack_b66) >> 4;
      uStack_1504 = (ushort)(sStack_1624 + sStack_15e4 + sStack_b74 + sStack_b54 + sStack_b64) >> 4;
      uStack_1502 = (ushort)(sStack_1622 + sStack_15e2 + sStack_b72 + sStack_b52 + sStack_b62) >> 4;
      uStack_1500 = (ushort)(sStack_1620 + sStack_15e0 + sStack_b70 + sStack_b50 + sStack_b60) >> 4;
      uStack_14fe = (ushort)(sStack_161e + sStack_15de + sStack_b6e + sStack_b4e + sStack_b5e) >> 4;
      uStack_14fc = (ushort)(sStack_161c + sStack_15dc + sStack_b6c + sStack_b4c + sStack_b5c) >> 4;
      uStack_14fa = (ushort)(sStack_161a + sStack_15da + sStack_b6a + sStack_b4a + sStack_b5a) >> 4;
      lVar1 = local_1358[1][0];
      lVar2 = local_1358[1][1];
      lVar3 = (*local_1358)[0];
      lVar4 = (*local_1358)[1];
      lVar5 = local_1358[2][0];
      lVar6 = local_1358[2][1];
      local_bd8 = (short)lVar3;
      sStack_bd6 = (short)((ulong)lVar3 >> 0x10);
      sStack_bd4 = (short)((ulong)lVar3 >> 0x20);
      sStack_bd2 = (short)((ulong)lVar3 >> 0x30);
      sStack_bd0 = (short)lVar4;
      sStack_bce = (short)((ulong)lVar4 >> 0x10);
      sStack_bcc = (short)((ulong)lVar4 >> 0x20);
      sStack_bca = (short)((ulong)lVar4 >> 0x30);
      local_be8 = (short)lVar5;
      sStack_be6 = (short)((ulong)lVar5 >> 0x10);
      sStack_be4 = (short)((ulong)lVar5 >> 0x20);
      sStack_be2 = (short)((ulong)lVar5 >> 0x30);
      sStack_be0 = (short)lVar6;
      sStack_bde = (short)((ulong)lVar6 >> 0x10);
      sStack_bdc = (short)((ulong)lVar6 >> 0x20);
      sStack_bda = (short)((ulong)lVar6 >> 0x30);
      local_bf8 = (short)lVar1;
      sStack_bf6 = (short)((ulong)lVar1 >> 0x10);
      sStack_bf4 = (short)((ulong)lVar1 >> 0x20);
      sStack_bf2 = (short)((ulong)lVar1 >> 0x30);
      sStack_bf0 = (short)lVar2;
      sStack_bee = (short)((ulong)lVar2 >> 0x10);
      sStack_bec = (short)((ulong)lVar2 >> 0x20);
      sStack_bea = (short)((ulong)lVar2 >> 0x30);
      local_1568 = (ushort)(local_15b8 + local_15f8 + local_bf8 + local_bd8 + local_be8) >> 4;
      uStack_1566 = (ushort)(sStack_15b6 + sStack_15f6 + sStack_bf6 + sStack_bd6 + sStack_be6) >> 4;
      uStack_1564 = (ushort)(sStack_15b4 + sStack_15f4 + sStack_bf4 + sStack_bd4 + sStack_be4) >> 4;
      uStack_1562 = (ushort)(sStack_15b2 + sStack_15f2 + sStack_bf2 + sStack_bd2 + sStack_be2) >> 4;
      uStack_1560 = (ushort)(sStack_15b0 + sStack_15f0 + sStack_bf0 + sStack_bd0 + sStack_be0) >> 4;
      uStack_155e = (ushort)(sStack_15ae + sStack_15ee + sStack_bee + sStack_bce + sStack_bde) >> 4;
      uStack_155c = (ushort)(sStack_15ac + sStack_15ec + sStack_bec + sStack_bcc + sStack_bdc) >> 4;
      uStack_155a = (ushort)(sStack_15aa + sStack_15ea + sStack_bea + sStack_bca + sStack_bda) >> 4;
      lVar1 = local_1350[6][0];
      lVar2 = local_1350[6][1];
      local_c68 = (short)lVar1;
      sStack_c66 = (short)((ulong)lVar1 >> 0x10);
      sStack_c64 = (short)((ulong)lVar1 >> 0x20);
      sStack_c62 = (short)((ulong)lVar1 >> 0x30);
      sStack_c60 = (short)lVar2;
      sStack_c5e = (short)((ulong)lVar2 >> 0x10);
      sStack_c5c = (short)((ulong)lVar2 >> 0x20);
      sStack_c5a = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_1358[6][0];
      lVar2 = local_1358[6][1];
      local_c88 = (short)lVar1;
      sStack_c86 = (short)((ulong)lVar1 >> 0x10);
      sStack_c84 = (short)((ulong)lVar1 >> 0x20);
      sStack_c82 = (short)((ulong)lVar1 >> 0x30);
      sStack_c80 = (short)lVar2;
      sStack_c7e = (short)((ulong)lVar2 >> 0x10);
      sStack_c7c = (short)((ulong)lVar2 >> 0x20);
      sStack_c7a = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_1358[4][0];
      lVar2 = local_1358[4][1];
      local_568 = (short)lVar1;
      sStack_566 = (short)((ulong)lVar1 >> 0x10);
      sStack_564 = (short)((ulong)lVar1 >> 0x20);
      sStack_562 = (short)((ulong)lVar1 >> 0x30);
      sStack_560 = (short)lVar2;
      sStack_55e = (short)((ulong)lVar2 >> 0x10);
      sStack_55c = (short)((ulong)lVar2 >> 0x20);
      sStack_55a = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_1350[4][0];
      lVar2 = local_1350[4][1];
      local_588 = (short)lVar1;
      sStack_586 = (short)((ulong)lVar1 >> 0x10);
      sStack_584 = (short)((ulong)lVar1 >> 0x20);
      sStack_582 = (short)((ulong)lVar1 >> 0x30);
      sStack_580 = (short)lVar2;
      sStack_57e = (short)((ulong)lVar2 >> 0x10);
      sStack_57c = (short)((ulong)lVar2 >> 0x20);
      sStack_57a = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_1350[2][0];
      lVar2 = local_1350[2][1];
      lVar3 = local_1350[3][0];
      lVar4 = local_1350[3][1];
      lVar5 = local_1350[1][0];
      lVar6 = local_1350[1][1];
      local_c98 = (short)lVar3;
      sStack_c96 = (short)((ulong)lVar3 >> 0x10);
      sStack_c94 = (short)((ulong)lVar3 >> 0x20);
      sStack_c92 = (short)((ulong)lVar3 >> 0x30);
      sStack_c90 = (short)lVar4;
      sStack_c8e = (short)((ulong)lVar4 >> 0x10);
      sStack_c8c = (short)((ulong)lVar4 >> 0x20);
      sStack_c8a = (short)((ulong)lVar4 >> 0x30);
      local_ca8 = (short)lVar5;
      sStack_ca6 = (short)((ulong)lVar5 >> 0x10);
      sStack_ca4 = (short)((ulong)lVar5 >> 0x20);
      sStack_ca2 = (short)((ulong)lVar5 >> 0x30);
      sStack_ca0 = (short)lVar6;
      sStack_c9e = (short)((ulong)lVar6 >> 0x10);
      sStack_c9c = (short)((ulong)lVar6 >> 0x20);
      sStack_c9a = (short)((ulong)lVar6 >> 0x30);
      local_cb8 = (short)lVar1;
      sStack_cb6 = (short)((ulong)lVar1 >> 0x10);
      sStack_cb4 = (short)((ulong)lVar1 >> 0x20);
      sStack_cb2 = (short)((ulong)lVar1 >> 0x30);
      sStack_cb0 = (short)lVar2;
      sStack_cae = (short)((ulong)lVar2 >> 0x10);
      sStack_cac = (short)((ulong)lVar2 >> 0x20);
      sStack_caa = (short)((ulong)lVar2 >> 0x30);
      local_14f8 = (ushort)((local_1628 - local_568) +
                           local_15e8 + local_c68 + local_cb8 + local_c98 + local_ca8) >> 4;
      uStack_14f6 = (ushort)((sStack_1626 - sStack_566) +
                            sStack_15e6 + sStack_c66 + sStack_cb6 + sStack_c96 + sStack_ca6) >> 4;
      uStack_14f4 = (ushort)((sStack_1624 - sStack_564) +
                            sStack_15e4 + sStack_c64 + sStack_cb4 + sStack_c94 + sStack_ca4) >> 4;
      uStack_14f2 = (ushort)((sStack_1622 - sStack_562) +
                            sStack_15e2 + sStack_c62 + sStack_cb2 + sStack_c92 + sStack_ca2) >> 4;
      uStack_14f0 = (ushort)((sStack_1620 - sStack_560) +
                            sStack_15e0 + sStack_c60 + sStack_cb0 + sStack_c90 + sStack_ca0) >> 4;
      uStack_14ee = (ushort)((sStack_161e - sStack_55e) +
                            sStack_15de + sStack_c5e + sStack_cae + sStack_c8e + sStack_c9e) >> 4;
      uStack_14ec = (ushort)((sStack_161c - sStack_55c) +
                            sStack_15dc + sStack_c5c + sStack_cac + sStack_c8c + sStack_c9c) >> 4;
      uStack_14ea = (ushort)((sStack_161a - sStack_55a) +
                            sStack_15da + sStack_c5a + sStack_caa + sStack_c8a + sStack_c9a) >> 4;
      lVar1 = local_1358[2][0];
      lVar2 = local_1358[2][1];
      lVar3 = local_1358[1][0];
      lVar4 = local_1358[1][1];
      lVar5 = local_1358[3][0];
      lVar6 = local_1358[3][1];
      local_d18 = (short)lVar3;
      sStack_d16 = (short)((ulong)lVar3 >> 0x10);
      sStack_d14 = (short)((ulong)lVar3 >> 0x20);
      sStack_d12 = (short)((ulong)lVar3 >> 0x30);
      sStack_d10 = (short)lVar4;
      sStack_d0e = (short)((ulong)lVar4 >> 0x10);
      sStack_d0c = (short)((ulong)lVar4 >> 0x20);
      sStack_d0a = (short)((ulong)lVar4 >> 0x30);
      local_d28 = (short)lVar5;
      sStack_d26 = (short)((ulong)lVar5 >> 0x10);
      sStack_d24 = (short)((ulong)lVar5 >> 0x20);
      sStack_d22 = (short)((ulong)lVar5 >> 0x30);
      sStack_d20 = (short)lVar6;
      sStack_d1e = (short)((ulong)lVar6 >> 0x10);
      sStack_d1c = (short)((ulong)lVar6 >> 0x20);
      sStack_d1a = (short)((ulong)lVar6 >> 0x30);
      local_d38 = (short)lVar1;
      sStack_d36 = (short)((ulong)lVar1 >> 0x10);
      sStack_d34 = (short)((ulong)lVar1 >> 0x20);
      sStack_d32 = (short)((ulong)lVar1 >> 0x30);
      sStack_d30 = (short)lVar2;
      sStack_d2e = (short)((ulong)lVar2 >> 0x10);
      sStack_d2c = (short)((ulong)lVar2 >> 0x20);
      sStack_d2a = (short)((ulong)lVar2 >> 0x30);
      local_1558 = (ushort)((local_15b8 - local_588) +
                           local_15f8 + local_c88 + local_d38 + local_d18 + local_d28) >> 4;
      uStack_1556 = (ushort)((sStack_15b6 - sStack_586) +
                            sStack_15f6 + sStack_c86 + sStack_d36 + sStack_d16 + sStack_d26) >> 4;
      uStack_1554 = (ushort)((sStack_15b4 - sStack_584) +
                            sStack_15f4 + sStack_c84 + sStack_d34 + sStack_d14 + sStack_d24) >> 4;
      uStack_1552 = (ushort)((sStack_15b2 - sStack_582) +
                            sStack_15f2 + sStack_c82 + sStack_d32 + sStack_d12 + sStack_d22) >> 4;
      uStack_1550 = (ushort)((sStack_15b0 - sStack_580) +
                            sStack_15f0 + sStack_c80 + sStack_d30 + sStack_d10 + sStack_d20) >> 4;
      uStack_154e = (ushort)((sStack_15ae - sStack_57e) +
                            sStack_15ee + sStack_c7e + sStack_d2e + sStack_d0e + sStack_d1e) >> 4;
      uStack_154c = (ushort)((sStack_15ac - sStack_57c) +
                            sStack_15ec + sStack_c7c + sStack_d2c + sStack_d0c + sStack_d1c) >> 4;
      uStack_154a = (ushort)((sStack_15aa - sStack_57a) +
                            sStack_15ea + sStack_c7a + sStack_d2a + sStack_d0a + sStack_d1a) >> 4;
      lVar1 = local_1350[6][0];
      lVar2 = local_1350[6][1];
      local_da8 = (short)lVar1;
      sStack_da6 = (short)((ulong)lVar1 >> 0x10);
      sStack_da4 = (short)((ulong)lVar1 >> 0x20);
      sStack_da2 = (short)((ulong)lVar1 >> 0x30);
      sStack_da0 = (short)lVar2;
      sStack_d9e = (short)((ulong)lVar2 >> 0x10);
      sStack_d9c = (short)((ulong)lVar2 >> 0x20);
      sStack_d9a = (short)((ulong)lVar2 >> 0x30);
      local_da8 = local_15e8 + local_c68 + local_da8;
      sStack_da6 = sStack_15e6 + sStack_c66 + sStack_da6;
      sStack_da4 = sStack_15e4 + sStack_c64 + sStack_da4;
      sStack_da2 = sStack_15e2 + sStack_c62 + sStack_da2;
      sStack_da0 = sStack_15e0 + sStack_c60 + sStack_da0;
      sStack_d9e = sStack_15de + sStack_c5e + sStack_d9e;
      sStack_d9c = sStack_15dc + sStack_c5c + sStack_d9c;
      sStack_d9a = sStack_15da + sStack_c5a + sStack_d9a;
      lVar1 = local_1358[6][0];
      lVar2 = local_1358[6][1];
      local_dc8 = (short)lVar1;
      sStack_dc6 = (short)((ulong)lVar1 >> 0x10);
      sStack_dc4 = (short)((ulong)lVar1 >> 0x20);
      sStack_dc2 = (short)((ulong)lVar1 >> 0x30);
      sStack_dc0 = (short)lVar2;
      sStack_dbe = (short)((ulong)lVar2 >> 0x10);
      sStack_dbc = (short)((ulong)lVar2 >> 0x20);
      sStack_dba = (short)((ulong)lVar2 >> 0x30);
      local_dc8 = local_15f8 + local_c88 + local_dc8;
      sStack_dc6 = sStack_15f6 + sStack_c86 + sStack_dc6;
      sStack_dc4 = sStack_15f4 + sStack_c84 + sStack_dc4;
      sStack_dc2 = sStack_15f2 + sStack_c82 + sStack_dc2;
      sStack_dc0 = sStack_15f0 + sStack_c80 + sStack_dc0;
      sStack_dbe = sStack_15ee + sStack_c7e + sStack_dbe;
      sStack_dbc = sStack_15ec + sStack_c7c + sStack_dbc;
      sStack_dba = sStack_15ea + sStack_c7a + sStack_dba;
      lVar1 = local_1358[3][0];
      lVar2 = local_1358[3][1];
      local_5a8 = (short)lVar1;
      sStack_5a6 = (short)((ulong)lVar1 >> 0x10);
      sStack_5a4 = (short)((ulong)lVar1 >> 0x20);
      sStack_5a2 = (short)((ulong)lVar1 >> 0x30);
      sStack_5a0 = (short)lVar2;
      sStack_59e = (short)((ulong)lVar2 >> 0x10);
      sStack_59c = (short)((ulong)lVar2 >> 0x20);
      sStack_59a = (short)((ulong)lVar2 >> 0x30);
      local_5a8 = (local_1628 - local_568) - local_5a8;
      sStack_5a6 = (sStack_1626 - sStack_566) - sStack_5a6;
      sStack_5a4 = (sStack_1624 - sStack_564) - sStack_5a4;
      sStack_5a2 = (sStack_1622 - sStack_562) - sStack_5a2;
      sStack_5a0 = (sStack_1620 - sStack_560) - sStack_5a0;
      sStack_59e = (sStack_161e - sStack_55e) - sStack_59e;
      sStack_59c = (sStack_161c - sStack_55c) - sStack_59c;
      sStack_59a = (sStack_161a - sStack_55a) - sStack_59a;
      lVar1 = local_1350[3][0];
      lVar2 = local_1350[3][1];
      local_5c8 = (short)lVar1;
      sStack_5c6 = (short)((ulong)lVar1 >> 0x10);
      sStack_5c4 = (short)((ulong)lVar1 >> 0x20);
      sStack_5c2 = (short)((ulong)lVar1 >> 0x30);
      sStack_5c0 = (short)lVar2;
      sStack_5be = (short)((ulong)lVar2 >> 0x10);
      sStack_5bc = (short)((ulong)lVar2 >> 0x20);
      sStack_5ba = (short)((ulong)lVar2 >> 0x30);
      local_5c8 = (local_15b8 - local_588) - local_5c8;
      sStack_5c6 = (sStack_15b6 - sStack_586) - sStack_5c6;
      sStack_5c4 = (sStack_15b4 - sStack_584) - sStack_5c4;
      sStack_5c2 = (sStack_15b2 - sStack_582) - sStack_5c2;
      sStack_5c0 = (sStack_15b0 - sStack_580) - sStack_5c0;
      sStack_5be = (sStack_15ae - sStack_57e) - sStack_5be;
      sStack_5bc = (sStack_15ac - sStack_57c) - sStack_5bc;
      sStack_5ba = (sStack_15aa - sStack_57a) - sStack_5ba;
      lVar1 = local_1350[3][0];
      lVar2 = local_1350[3][1];
      lVar3 = local_1350[4][0];
      lVar4 = local_1350[4][1];
      lVar5 = local_1350[2][0];
      lVar6 = local_1350[2][1];
      local_dd8 = (short)lVar3;
      sStack_dd6 = (short)((ulong)lVar3 >> 0x10);
      sStack_dd4 = (short)((ulong)lVar3 >> 0x20);
      sStack_dd2 = (short)((ulong)lVar3 >> 0x30);
      sStack_dd0 = (short)lVar4;
      sStack_dce = (short)((ulong)lVar4 >> 0x10);
      sStack_dcc = (short)((ulong)lVar4 >> 0x20);
      sStack_dca = (short)((ulong)lVar4 >> 0x30);
      sStack_de0 = (short)lVar6;
      sStack_dde = (short)((ulong)lVar6 >> 0x10);
      sStack_ddc = (short)((ulong)lVar6 >> 0x20);
      sStack_dda = (short)((ulong)lVar6 >> 0x30);
      local_e08 = local_dd8 + (short)lVar5;
      sStack_e06 = sStack_dd6 + (short)((ulong)lVar5 >> 0x10);
      sStack_e04 = sStack_dd4 + (short)((ulong)lVar5 >> 0x20);
      sStack_e02 = sStack_dd2 + (short)((ulong)lVar5 >> 0x30);
      local_df8 = lVar1;
      sStack_e00 = sStack_dd0 + sStack_de0;
      sStack_dfe = sStack_dce + sStack_dde;
      sStack_dfc = sStack_dcc + sStack_ddc;
      sStack_dfa = sStack_dca + sStack_dda;
      local_df8._0_2_ = (short)lVar1;
      local_df8._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_df8._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_df8._6_2_ = (short)((ulong)lVar1 >> 0x30);
      sStack_dec = (short)((ulong)lVar2 >> 0x20);
      sStack_dea = (short)((ulong)lVar2 >> 0x30);
      local_e28 = (short)local_df8 + local_e08;
      sStack_e26 = local_df8._2_2_ + sStack_e06;
      sStack_e24 = local_df8._4_2_ + sStack_e04;
      sStack_e22 = local_df8._6_2_ + sStack_e02;
      sStack_e20 = (short)lVar2 + sStack_dd0 + sStack_de0;
      sStack_e1e = (short)((ulong)lVar2 >> 0x10) + sStack_dce + sStack_dde;
      sStack_e1c = sStack_dec + sStack_dcc + sStack_ddc;
      sStack_e1a = sStack_dea + sStack_dca + sStack_dda;
      local_e18 = CONCAT26(sStack_da2,CONCAT24(sStack_da4,CONCAT22(sStack_da6,local_da8)));
      uStack_e10 = CONCAT26(sStack_d9a,CONCAT24(sStack_d9c,CONCAT22(sStack_d9e,sStack_da0)));
      local_e48 = local_da8 + local_e28;
      sStack_e46 = sStack_da6 + sStack_e26;
      sStack_e44 = sStack_da4 + sStack_e24;
      sStack_e42 = sStack_da2 + sStack_e22;
      sStack_e40 = sStack_da0 + sStack_e20;
      sStack_e3e = sStack_d9e + sStack_e1e;
      sStack_e3c = sStack_d9c + sStack_e1c;
      sStack_e3a = sStack_d9a + sStack_e1a;
      local_e38 = CONCAT26(sStack_5a2,CONCAT24(sStack_5a4,CONCAT22(sStack_5a6,local_5a8)));
      uStack_e30 = CONCAT26(sStack_59a,CONCAT24(sStack_59c,CONCAT22(sStack_59e,sStack_5a0)));
      local_14e8 = (ushort)(local_5a8 + local_e48) >> 4;
      uStack_14e6 = (ushort)(sStack_5a6 + sStack_e46) >> 4;
      uStack_14e4 = (ushort)(sStack_5a4 + sStack_e44) >> 4;
      uStack_14e2 = (ushort)(sStack_5a2 + sStack_e42) >> 4;
      uStack_14e0 = (ushort)(sStack_5a0 + sStack_e40) >> 4;
      uStack_14de = (ushort)(sStack_59e + sStack_e3e) >> 4;
      uStack_14dc = (ushort)(sStack_59c + sStack_e3c) >> 4;
      uStack_14da = (ushort)(sStack_59a + sStack_e3a) >> 4;
      lVar1 = local_1358[3][0];
      lVar2 = local_1358[3][1];
      lVar3 = local_1358[2][0];
      lVar4 = local_1358[2][1];
      lVar5 = local_1358[4][0];
      lVar6 = local_1358[4][1];
      local_e58 = lVar3;
      uStack_e50 = lVar4;
      local_e68 = lVar5;
      uStack_e60 = lVar6;
      local_e58._0_2_ = (short)lVar3;
      local_e58._2_2_ = (short)((ulong)lVar3 >> 0x10);
      local_e58._4_2_ = (short)((ulong)lVar3 >> 0x20);
      local_e58._6_2_ = (short)((ulong)lVar3 >> 0x30);
      uStack_e50._0_2_ = (short)lVar4;
      uStack_e50._2_2_ = (short)((ulong)lVar4 >> 0x10);
      uStack_e50._4_2_ = (short)((ulong)lVar4 >> 0x20);
      uStack_e50._6_2_ = (short)((ulong)lVar4 >> 0x30);
      local_e68._0_2_ = (short)lVar5;
      local_e68._2_2_ = (short)((ulong)lVar5 >> 0x10);
      local_e68._4_2_ = (short)((ulong)lVar5 >> 0x20);
      local_e68._6_2_ = (short)((ulong)lVar5 >> 0x30);
      uStack_e60._0_2_ = (short)lVar6;
      uStack_e60._2_2_ = (short)((ulong)lVar6 >> 0x10);
      uStack_e60._4_2_ = (short)((ulong)lVar6 >> 0x20);
      uStack_e60._6_2_ = (short)((ulong)lVar6 >> 0x30);
      local_e78 = lVar1;
      uStack_e70 = lVar2;
      local_e88 = (short)local_e58 + (short)local_e68;
      sStack_e86 = local_e58._2_2_ + local_e68._2_2_;
      sStack_e84 = local_e58._4_2_ + local_e68._4_2_;
      sStack_e82 = local_e58._6_2_ + local_e68._6_2_;
      sStack_e80 = (short)uStack_e50 + (short)uStack_e60;
      sStack_e7e = uStack_e50._2_2_ + uStack_e60._2_2_;
      sStack_e7c = uStack_e50._4_2_ + uStack_e60._4_2_;
      sStack_e7a = uStack_e50._6_2_ + uStack_e60._6_2_;
      local_e78._0_2_ = (short)lVar1;
      local_e78._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_e78._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_e78._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_e70._0_2_ = (short)lVar2;
      uStack_e70._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_e70._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_e70._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_ea8 = (short)local_e78 + (short)local_e58 + (short)local_e68;
      sStack_ea6 = local_e78._2_2_ + local_e58._2_2_ + local_e68._2_2_;
      sStack_ea4 = local_e78._4_2_ + local_e58._4_2_ + local_e68._4_2_;
      sStack_ea2 = local_e78._6_2_ + local_e58._6_2_ + local_e68._6_2_;
      sStack_ea0 = (short)uStack_e70 + (short)uStack_e50 + (short)uStack_e60;
      sStack_e9e = uStack_e70._2_2_ + uStack_e50._2_2_ + uStack_e60._2_2_;
      sStack_e9c = uStack_e70._4_2_ + uStack_e50._4_2_ + uStack_e60._4_2_;
      sStack_e9a = uStack_e70._6_2_ + uStack_e50._6_2_ + uStack_e60._6_2_;
      local_e98 = CONCAT26(sStack_dc2,CONCAT24(sStack_dc4,CONCAT22(sStack_dc6,local_dc8)));
      uStack_e90 = CONCAT26(sStack_dba,CONCAT24(sStack_dbc,CONCAT22(sStack_dbe,sStack_dc0)));
      local_ec8 = local_dc8 + local_ea8;
      sStack_ec6 = sStack_dc6 + sStack_ea6;
      sStack_ec4 = sStack_dc4 + sStack_ea4;
      sStack_ec2 = sStack_dc2 + sStack_ea2;
      sStack_ec0 = sStack_dc0 + sStack_ea0;
      sStack_ebe = sStack_dbe + sStack_e9e;
      sStack_ebc = sStack_dbc + sStack_e9c;
      sStack_eba = sStack_dba + sStack_e9a;
      local_eb8 = CONCAT26(sStack_5c2,CONCAT24(sStack_5c4,CONCAT22(sStack_5c6,local_5c8)));
      uStack_eb0 = CONCAT26(sStack_5ba,CONCAT24(sStack_5bc,CONCAT22(sStack_5be,sStack_5c0)));
      local_1548 = (ushort)(local_5c8 + local_ec8) >> 4;
      uStack_1546 = (ushort)(sStack_5c6 + sStack_ec6) >> 4;
      uStack_1544 = (ushort)(sStack_5c4 + sStack_ec4) >> 4;
      uStack_1542 = (ushort)(sStack_5c2 + sStack_ec2) >> 4;
      uStack_1540 = (ushort)(sStack_5c0 + sStack_ec0) >> 4;
      uStack_153e = (ushort)(sStack_5be + sStack_ebe) >> 4;
      uStack_153c = (ushort)(sStack_5bc + sStack_ebc) >> 4;
      uStack_153a = (ushort)(sStack_5ba + sStack_eba) >> 4;
      lVar1 = local_1350[6][0];
      lVar2 = local_1350[6][1];
      local_ed8 = CONCAT26(sStack_da2,CONCAT24(sStack_da4,CONCAT22(sStack_da6,local_da8)));
      uStack_ed0 = CONCAT26(sStack_d9a,CONCAT24(sStack_d9c,CONCAT22(sStack_d9e,sStack_da0)));
      local_ee8 = lVar1;
      uStack_ee0 = lVar2;
      local_ee8._0_2_ = (short)lVar1;
      local_ee8._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_ee8._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_ee8._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_ee0._0_2_ = (short)lVar2;
      uStack_ee0._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_ee0._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_ee0._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_da8 = local_da8 + (short)local_ee8;
      sStack_da6 = sStack_da6 + local_ee8._2_2_;
      sStack_da4 = sStack_da4 + local_ee8._4_2_;
      sStack_da2 = sStack_da2 + local_ee8._6_2_;
      sStack_da0 = sStack_da0 + (short)uStack_ee0;
      sStack_d9e = sStack_d9e + uStack_ee0._2_2_;
      sStack_d9c = sStack_d9c + uStack_ee0._4_2_;
      sStack_d9a = sStack_d9a + uStack_ee0._6_2_;
      lVar1 = local_1358[6][0];
      lVar2 = local_1358[6][1];
      local_ef8 = CONCAT26(sStack_dc2,CONCAT24(sStack_dc4,CONCAT22(sStack_dc6,local_dc8)));
      uStack_ef0 = CONCAT26(sStack_dba,CONCAT24(sStack_dbc,CONCAT22(sStack_dbe,sStack_dc0)));
      local_f08 = lVar1;
      uStack_f00 = lVar2;
      local_f08._0_2_ = (short)lVar1;
      local_f08._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_f08._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_f08._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_f00._0_2_ = (short)lVar2;
      uStack_f00._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_f00._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_f00._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_dc8 = local_dc8 + (short)local_f08;
      sStack_dc6 = sStack_dc6 + local_f08._2_2_;
      sStack_dc4 = sStack_dc4 + local_f08._4_2_;
      sStack_dc2 = sStack_dc2 + local_f08._6_2_;
      sStack_dc0 = sStack_dc0 + (short)uStack_f00;
      sStack_dbe = sStack_dbe + uStack_f00._2_2_;
      sStack_dbc = sStack_dbc + uStack_f00._4_2_;
      sStack_dba = sStack_dba + uStack_f00._6_2_;
      lVar1 = local_1358[2][0];
      lVar2 = local_1358[2][1];
      local_5e8 = (short)lVar1;
      sStack_5e6 = (short)((ulong)lVar1 >> 0x10);
      sStack_5e4 = (short)((ulong)lVar1 >> 0x20);
      sStack_5e2 = (short)((ulong)lVar1 >> 0x30);
      sStack_5e0 = (short)lVar2;
      sStack_5de = (short)((ulong)lVar2 >> 0x10);
      sStack_5dc = (short)((ulong)lVar2 >> 0x20);
      sStack_5da = (short)((ulong)lVar2 >> 0x30);
      local_5a8 = local_5a8 - local_5e8;
      sStack_5a6 = sStack_5a6 - sStack_5e6;
      sStack_5a4 = sStack_5a4 - sStack_5e4;
      sStack_5a2 = sStack_5a2 - sStack_5e2;
      sStack_5a0 = sStack_5a0 - sStack_5e0;
      sStack_59e = sStack_59e - sStack_5de;
      sStack_59c = sStack_59c - sStack_5dc;
      sStack_59a = sStack_59a - sStack_5da;
      lVar1 = local_1350[2][0];
      lVar2 = local_1350[2][1];
      local_608 = (short)lVar1;
      sStack_606 = (short)((ulong)lVar1 >> 0x10);
      sStack_604 = (short)((ulong)lVar1 >> 0x20);
      sStack_602 = (short)((ulong)lVar1 >> 0x30);
      sStack_600 = (short)lVar2;
      sStack_5fe = (short)((ulong)lVar2 >> 0x10);
      sStack_5fc = (short)((ulong)lVar2 >> 0x20);
      sStack_5fa = (short)((ulong)lVar2 >> 0x30);
      local_5c8 = local_5c8 - local_608;
      sStack_5c6 = sStack_5c6 - sStack_606;
      sStack_5c4 = sStack_5c4 - sStack_604;
      sStack_5c2 = sStack_5c2 - sStack_602;
      sStack_5c0 = sStack_5c0 - sStack_600;
      sStack_5be = sStack_5be - sStack_5fe;
      sStack_5bc = sStack_5bc - sStack_5fc;
      sStack_5ba = sStack_5ba - sStack_5fa;
      lVar1 = local_1350[4][0];
      lVar2 = local_1350[4][1];
      lVar3 = local_1350[5][0];
      lVar4 = local_1350[5][1];
      lVar5 = local_1350[3][0];
      lVar6 = local_1350[3][1];
      local_f18 = lVar3;
      uStack_f10 = lVar4;
      local_f28 = lVar5;
      uStack_f20 = lVar6;
      local_f18._0_2_ = (short)lVar3;
      local_f18._2_2_ = (short)((ulong)lVar3 >> 0x10);
      local_f18._4_2_ = (short)((ulong)lVar3 >> 0x20);
      local_f18._6_2_ = (short)((ulong)lVar3 >> 0x30);
      uStack_f10._0_2_ = (short)lVar4;
      uStack_f10._2_2_ = (short)((ulong)lVar4 >> 0x10);
      uStack_f10._4_2_ = (short)((ulong)lVar4 >> 0x20);
      uStack_f10._6_2_ = (short)((ulong)lVar4 >> 0x30);
      local_f28._0_2_ = (short)lVar5;
      local_f28._2_2_ = (short)((ulong)lVar5 >> 0x10);
      local_f28._4_2_ = (short)((ulong)lVar5 >> 0x20);
      local_f28._6_2_ = (short)((ulong)lVar5 >> 0x30);
      uStack_f20._0_2_ = (short)lVar6;
      uStack_f20._2_2_ = (short)((ulong)lVar6 >> 0x10);
      uStack_f20._4_2_ = (short)((ulong)lVar6 >> 0x20);
      uStack_f20._6_2_ = (short)((ulong)lVar6 >> 0x30);
      local_f38 = lVar1;
      uStack_f30 = lVar2;
      local_f48 = (short)local_f18 + (short)local_f28;
      sStack_f46 = local_f18._2_2_ + local_f28._2_2_;
      sStack_f44 = local_f18._4_2_ + local_f28._4_2_;
      sStack_f42 = local_f18._6_2_ + local_f28._6_2_;
      sStack_f40 = (short)uStack_f10 + (short)uStack_f20;
      sStack_f3e = uStack_f10._2_2_ + uStack_f20._2_2_;
      sStack_f3c = uStack_f10._4_2_ + uStack_f20._4_2_;
      sStack_f3a = uStack_f10._6_2_ + uStack_f20._6_2_;
      local_f38._0_2_ = (short)lVar1;
      local_f38._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_f38._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_f38._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_f30._0_2_ = (short)lVar2;
      uStack_f30._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_f30._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_f30._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_f68 = (short)local_f38 + (short)local_f18 + (short)local_f28;
      sStack_f66 = local_f38._2_2_ + local_f18._2_2_ + local_f28._2_2_;
      sStack_f64 = local_f38._4_2_ + local_f18._4_2_ + local_f28._4_2_;
      sStack_f62 = local_f38._6_2_ + local_f18._6_2_ + local_f28._6_2_;
      sStack_f60 = (short)uStack_f30 + (short)uStack_f10 + (short)uStack_f20;
      sStack_f5e = uStack_f30._2_2_ + uStack_f10._2_2_ + uStack_f20._2_2_;
      sStack_f5c = uStack_f30._4_2_ + uStack_f10._4_2_ + uStack_f20._4_2_;
      sStack_f5a = uStack_f30._6_2_ + uStack_f10._6_2_ + uStack_f20._6_2_;
      local_f58 = CONCAT26(sStack_da2,CONCAT24(sStack_da4,CONCAT22(sStack_da6,local_da8)));
      uStack_f50 = CONCAT26(sStack_d9a,CONCAT24(sStack_d9c,CONCAT22(sStack_d9e,sStack_da0)));
      local_f88 = local_da8 + local_f68;
      sStack_f86 = sStack_da6 + sStack_f66;
      sStack_f84 = sStack_da4 + sStack_f64;
      sStack_f82 = sStack_da2 + sStack_f62;
      sStack_f80 = sStack_da0 + sStack_f60;
      sStack_f7e = sStack_d9e + sStack_f5e;
      sStack_f7c = sStack_d9c + sStack_f5c;
      sStack_f7a = sStack_d9a + sStack_f5a;
      local_f78 = CONCAT26(sStack_5a2,CONCAT24(sStack_5a4,CONCAT22(sStack_5a6,local_5a8)));
      uStack_f70 = CONCAT26(sStack_59a,CONCAT24(sStack_59c,CONCAT22(sStack_59e,sStack_5a0)));
      local_14d8 = (ushort)(local_5a8 + local_f88) >> 4;
      uStack_14d6 = (ushort)(sStack_5a6 + sStack_f86) >> 4;
      uStack_14d4 = (ushort)(sStack_5a4 + sStack_f84) >> 4;
      uStack_14d2 = (ushort)(sStack_5a2 + sStack_f82) >> 4;
      uStack_14d0 = (ushort)(sStack_5a0 + sStack_f80) >> 4;
      uStack_14ce = (ushort)(sStack_59e + sStack_f7e) >> 4;
      uStack_14cc = (ushort)(sStack_59c + sStack_f7c) >> 4;
      uStack_14ca = (ushort)(sStack_59a + sStack_f7a) >> 4;
      lVar1 = local_1358[4][0];
      lVar2 = local_1358[4][1];
      lVar3 = local_1358[3][0];
      lVar4 = local_1358[3][1];
      lVar5 = local_1358[5][0];
      lVar6 = local_1358[5][1];
      local_f98 = lVar3;
      uStack_f90 = lVar4;
      local_fa8 = lVar5;
      uStack_fa0 = lVar6;
      local_f98._0_2_ = (short)lVar3;
      local_f98._2_2_ = (short)((ulong)lVar3 >> 0x10);
      local_f98._4_2_ = (short)((ulong)lVar3 >> 0x20);
      local_f98._6_2_ = (short)((ulong)lVar3 >> 0x30);
      uStack_f90._0_2_ = (short)lVar4;
      uStack_f90._2_2_ = (short)((ulong)lVar4 >> 0x10);
      uStack_f90._4_2_ = (short)((ulong)lVar4 >> 0x20);
      uStack_f90._6_2_ = (short)((ulong)lVar4 >> 0x30);
      local_fa8._0_2_ = (short)lVar5;
      local_fa8._2_2_ = (short)((ulong)lVar5 >> 0x10);
      local_fa8._4_2_ = (short)((ulong)lVar5 >> 0x20);
      local_fa8._6_2_ = (short)((ulong)lVar5 >> 0x30);
      uStack_fa0._0_2_ = (short)lVar6;
      uStack_fa0._2_2_ = (short)((ulong)lVar6 >> 0x10);
      uStack_fa0._4_2_ = (short)((ulong)lVar6 >> 0x20);
      uStack_fa0._6_2_ = (short)((ulong)lVar6 >> 0x30);
      local_fb8 = lVar1;
      uStack_fb0 = lVar2;
      local_fc8 = (short)local_f98 + (short)local_fa8;
      sStack_fc6 = local_f98._2_2_ + local_fa8._2_2_;
      sStack_fc4 = local_f98._4_2_ + local_fa8._4_2_;
      sStack_fc2 = local_f98._6_2_ + local_fa8._6_2_;
      sStack_fc0 = (short)uStack_f90 + (short)uStack_fa0;
      sStack_fbe = uStack_f90._2_2_ + uStack_fa0._2_2_;
      sStack_fbc = uStack_f90._4_2_ + uStack_fa0._4_2_;
      sStack_fba = uStack_f90._6_2_ + uStack_fa0._6_2_;
      local_fb8._0_2_ = (short)lVar1;
      local_fb8._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_fb8._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_fb8._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_fb0._0_2_ = (short)lVar2;
      uStack_fb0._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_fb0._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_fb0._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_fe8 = (short)local_fb8 + (short)local_f98 + (short)local_fa8;
      sStack_fe6 = local_fb8._2_2_ + local_f98._2_2_ + local_fa8._2_2_;
      sStack_fe4 = local_fb8._4_2_ + local_f98._4_2_ + local_fa8._4_2_;
      sStack_fe2 = local_fb8._6_2_ + local_f98._6_2_ + local_fa8._6_2_;
      sStack_fe0 = (short)uStack_fb0 + (short)uStack_f90 + (short)uStack_fa0;
      sStack_fde = uStack_fb0._2_2_ + uStack_f90._2_2_ + uStack_fa0._2_2_;
      sStack_fdc = uStack_fb0._4_2_ + uStack_f90._4_2_ + uStack_fa0._4_2_;
      sStack_fda = uStack_fb0._6_2_ + uStack_f90._6_2_ + uStack_fa0._6_2_;
      local_fd8 = CONCAT26(sStack_dc2,CONCAT24(sStack_dc4,CONCAT22(sStack_dc6,local_dc8)));
      uStack_fd0 = CONCAT26(sStack_dba,CONCAT24(sStack_dbc,CONCAT22(sStack_dbe,sStack_dc0)));
      local_1008 = local_dc8 + local_fe8;
      sStack_1006 = sStack_dc6 + sStack_fe6;
      sStack_1004 = sStack_dc4 + sStack_fe4;
      sStack_1002 = sStack_dc2 + sStack_fe2;
      sStack_1000 = sStack_dc0 + sStack_fe0;
      sStack_ffe = sStack_dbe + sStack_fde;
      sStack_ffc = sStack_dbc + sStack_fdc;
      sStack_ffa = sStack_dba + sStack_fda;
      local_ff8 = CONCAT26(sStack_5c2,CONCAT24(sStack_5c4,CONCAT22(sStack_5c6,local_5c8)));
      uStack_ff0 = CONCAT26(sStack_5ba,CONCAT24(sStack_5bc,CONCAT22(sStack_5be,sStack_5c0)));
      local_1538 = (ushort)(local_5c8 + local_1008) >> 4;
      uStack_1536 = (ushort)(sStack_5c6 + sStack_1006) >> 4;
      uStack_1534 = (ushort)(sStack_5c4 + sStack_1004) >> 4;
      uStack_1532 = (ushort)(sStack_5c2 + sStack_1002) >> 4;
      uStack_1530 = (ushort)(sStack_5c0 + sStack_1000) >> 4;
      uStack_152e = (ushort)(sStack_5be + sStack_ffe) >> 4;
      uStack_152c = (ushort)(sStack_5bc + sStack_ffc) >> 4;
      uStack_152a = (ushort)(sStack_5ba + sStack_ffa) >> 4;
      lVar1 = local_1350[6][0];
      lVar2 = local_1350[6][1];
      local_1018 = CONCAT26(sStack_da2,CONCAT24(sStack_da4,CONCAT22(sStack_da6,local_da8)));
      uStack_1010 = CONCAT26(sStack_d9a,CONCAT24(sStack_d9c,CONCAT22(sStack_d9e,sStack_da0)));
      local_1028 = lVar1;
      uStack_1020 = lVar2;
      local_1028._0_2_ = (short)lVar1;
      local_1028._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_1028._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_1028._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_1020._0_2_ = (short)lVar2;
      uStack_1020._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_1020._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_1020._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_15e8 = local_da8 + (short)local_1028;
      sStack_15e6 = sStack_da6 + local_1028._2_2_;
      sStack_15e4 = sStack_da4 + local_1028._4_2_;
      sStack_15e2 = sStack_da2 + local_1028._6_2_;
      sStack_15e0 = sStack_da0 + (short)uStack_1020;
      sStack_15de = sStack_d9e + uStack_1020._2_2_;
      sStack_15dc = sStack_d9c + uStack_1020._4_2_;
      sStack_15da = sStack_d9a + uStack_1020._6_2_;
      lVar1 = local_1358[6][0];
      lVar2 = local_1358[6][1];
      local_1038 = CONCAT26(sStack_dc2,CONCAT24(sStack_dc4,CONCAT22(sStack_dc6,local_dc8)));
      uStack_1030 = CONCAT26(sStack_dba,CONCAT24(sStack_dbc,CONCAT22(sStack_dbe,sStack_dc0)));
      local_1048 = lVar1;
      uStack_1040 = lVar2;
      local_1048._0_2_ = (short)lVar1;
      local_1048._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_1048._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_1048._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_1040._0_2_ = (short)lVar2;
      uStack_1040._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_1040._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_1040._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_15f8 = local_dc8 + (short)local_1048;
      sStack_15f6 = sStack_dc6 + local_1048._2_2_;
      sStack_15f4 = sStack_dc4 + local_1048._4_2_;
      sStack_15f2 = sStack_dc2 + local_1048._6_2_;
      sStack_15f0 = sStack_dc0 + (short)uStack_1040;
      sStack_15ee = sStack_dbe + uStack_1040._2_2_;
      sStack_15ec = sStack_dbc + uStack_1040._4_2_;
      sStack_15ea = sStack_dba + uStack_1040._6_2_;
      lVar1 = local_1358[1][0];
      lVar2 = local_1358[1][1];
      local_628 = (short)lVar1;
      sStack_626 = (short)((ulong)lVar1 >> 0x10);
      sStack_624 = (short)((ulong)lVar1 >> 0x20);
      sStack_622 = (short)((ulong)lVar1 >> 0x30);
      sStack_620 = (short)lVar2;
      sStack_61e = (short)((ulong)lVar2 >> 0x10);
      sStack_61c = (short)((ulong)lVar2 >> 0x20);
      sStack_61a = (short)((ulong)lVar2 >> 0x30);
      local_1628 = local_5a8 - local_628;
      sStack_1626 = sStack_5a6 - sStack_626;
      sStack_1624 = sStack_5a4 - sStack_624;
      sStack_1622 = sStack_5a2 - sStack_622;
      sStack_1620 = sStack_5a0 - sStack_620;
      sStack_161e = sStack_59e - sStack_61e;
      sStack_161c = sStack_59c - sStack_61c;
      sStack_161a = sStack_59a - sStack_61a;
      lVar1 = local_1350[1][0];
      lVar2 = local_1350[1][1];
      local_648 = (short)lVar1;
      sStack_646 = (short)((ulong)lVar1 >> 0x10);
      sStack_644 = (short)((ulong)lVar1 >> 0x20);
      sStack_642 = (short)((ulong)lVar1 >> 0x30);
      sStack_640 = (short)lVar2;
      sStack_63e = (short)((ulong)lVar2 >> 0x10);
      sStack_63c = (short)((ulong)lVar2 >> 0x20);
      sStack_63a = (short)((ulong)lVar2 >> 0x30);
      local_15b8 = local_5c8 - local_648;
      sStack_15b6 = sStack_5c6 - sStack_646;
      sStack_15b4 = sStack_5c4 - sStack_644;
      sStack_15b2 = sStack_5c2 - sStack_642;
      sStack_15b0 = sStack_5c0 - sStack_640;
      sStack_15ae = sStack_5be - sStack_63e;
      sStack_15ac = sStack_5bc - sStack_63c;
      sStack_15aa = sStack_5ba - sStack_63a;
      lVar1 = local_1350[5][0];
      lVar2 = local_1350[5][1];
      lVar3 = local_1350[6][0];
      lVar4 = local_1350[6][1];
      lVar5 = local_1350[4][0];
      lVar6 = local_1350[4][1];
      local_1058 = lVar3;
      uStack_1050 = lVar4;
      local_1068 = lVar5;
      uStack_1060 = lVar6;
      local_1058._0_2_ = (short)lVar3;
      local_1058._2_2_ = (short)((ulong)lVar3 >> 0x10);
      local_1058._4_2_ = (short)((ulong)lVar3 >> 0x20);
      local_1058._6_2_ = (short)((ulong)lVar3 >> 0x30);
      uStack_1050._0_2_ = (short)lVar4;
      uStack_1050._2_2_ = (short)((ulong)lVar4 >> 0x10);
      uStack_1050._4_2_ = (short)((ulong)lVar4 >> 0x20);
      uStack_1050._6_2_ = (short)((ulong)lVar4 >> 0x30);
      local_1068._0_2_ = (short)lVar5;
      local_1068._2_2_ = (short)((ulong)lVar5 >> 0x10);
      local_1068._4_2_ = (short)((ulong)lVar5 >> 0x20);
      local_1068._6_2_ = (short)((ulong)lVar5 >> 0x30);
      uStack_1060._0_2_ = (short)lVar6;
      uStack_1060._2_2_ = (short)((ulong)lVar6 >> 0x10);
      uStack_1060._4_2_ = (short)((ulong)lVar6 >> 0x20);
      uStack_1060._6_2_ = (short)((ulong)lVar6 >> 0x30);
      local_1078 = lVar1;
      uStack_1070 = lVar2;
      local_1088 = (short)local_1058 + (short)local_1068;
      sStack_1086 = local_1058._2_2_ + local_1068._2_2_;
      sStack_1084 = local_1058._4_2_ + local_1068._4_2_;
      sStack_1082 = local_1058._6_2_ + local_1068._6_2_;
      sStack_1080 = (short)uStack_1050 + (short)uStack_1060;
      sStack_107e = uStack_1050._2_2_ + uStack_1060._2_2_;
      sStack_107c = uStack_1050._4_2_ + uStack_1060._4_2_;
      sStack_107a = uStack_1050._6_2_ + uStack_1060._6_2_;
      local_1078._0_2_ = (short)lVar1;
      local_1078._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_1078._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_1078._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_1070._0_2_ = (short)lVar2;
      uStack_1070._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_1070._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_1070._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_10a8 = (short)local_1078 + (short)local_1058 + (short)local_1068;
      sStack_10a6 = local_1078._2_2_ + local_1058._2_2_ + local_1068._2_2_;
      sStack_10a4 = local_1078._4_2_ + local_1058._4_2_ + local_1068._4_2_;
      sStack_10a2 = local_1078._6_2_ + local_1058._6_2_ + local_1068._6_2_;
      sStack_10a0 = (short)uStack_1070 + (short)uStack_1050 + (short)uStack_1060;
      sStack_109e = uStack_1070._2_2_ + uStack_1050._2_2_ + uStack_1060._2_2_;
      sStack_109c = uStack_1070._4_2_ + uStack_1050._4_2_ + uStack_1060._4_2_;
      sStack_109a = uStack_1070._6_2_ + uStack_1050._6_2_ + uStack_1060._6_2_;
      local_1098 = CONCAT26(sStack_15e2,CONCAT24(sStack_15e4,CONCAT22(sStack_15e6,local_15e8)));
      uStack_1090 = CONCAT26(sStack_15da,CONCAT24(sStack_15dc,CONCAT22(sStack_15de,sStack_15e0)));
      local_10c8 = local_15e8 + local_10a8;
      sStack_10c6 = sStack_15e6 + sStack_10a6;
      sStack_10c4 = sStack_15e4 + sStack_10a4;
      sStack_10c2 = sStack_15e2 + sStack_10a2;
      sStack_10c0 = sStack_15e0 + sStack_10a0;
      sStack_10be = sStack_15de + sStack_109e;
      sStack_10bc = sStack_15dc + sStack_109c;
      sStack_10ba = sStack_15da + sStack_109a;
      local_10b8 = CONCAT26(sStack_1622,CONCAT24(sStack_1624,CONCAT22(sStack_1626,local_1628)));
      uStack_10b0 = CONCAT26(sStack_161a,CONCAT24(sStack_161c,CONCAT22(sStack_161e,sStack_1620)));
      local_14c8 = (ushort)(local_1628 + local_10c8) >> 4;
      uStack_14c6 = (ushort)(sStack_1626 + sStack_10c6) >> 4;
      uStack_14c4 = (ushort)(sStack_1624 + sStack_10c4) >> 4;
      uStack_14c2 = (ushort)(sStack_1622 + sStack_10c2) >> 4;
      uStack_14c0 = (ushort)(sStack_1620 + sStack_10c0) >> 4;
      uStack_14be = (ushort)(sStack_161e + sStack_10be) >> 4;
      uStack_14bc = (ushort)(sStack_161c + sStack_10bc) >> 4;
      uStack_14ba = (ushort)(sStack_161a + sStack_10ba) >> 4;
      lVar1 = local_1358[5][0];
      lVar2 = local_1358[5][1];
      lVar3 = local_1358[4][0];
      lVar4 = local_1358[4][1];
      lVar5 = local_1358[6][0];
      lVar6 = local_1358[6][1];
      local_10d8 = lVar3;
      uStack_10d0 = lVar4;
      local_10e8 = lVar5;
      uStack_10e0 = lVar6;
      local_10d8._0_2_ = (short)lVar3;
      local_10d8._2_2_ = (short)((ulong)lVar3 >> 0x10);
      local_10d8._4_2_ = (short)((ulong)lVar3 >> 0x20);
      local_10d8._6_2_ = (short)((ulong)lVar3 >> 0x30);
      uStack_10d0._0_2_ = (short)lVar4;
      uStack_10d0._2_2_ = (short)((ulong)lVar4 >> 0x10);
      uStack_10d0._4_2_ = (short)((ulong)lVar4 >> 0x20);
      uStack_10d0._6_2_ = (short)((ulong)lVar4 >> 0x30);
      local_10e8._0_2_ = (short)lVar5;
      local_10e8._2_2_ = (short)((ulong)lVar5 >> 0x10);
      local_10e8._4_2_ = (short)((ulong)lVar5 >> 0x20);
      local_10e8._6_2_ = (short)((ulong)lVar5 >> 0x30);
      uStack_10e0._0_2_ = (short)lVar6;
      uStack_10e0._2_2_ = (short)((ulong)lVar6 >> 0x10);
      uStack_10e0._4_2_ = (short)((ulong)lVar6 >> 0x20);
      uStack_10e0._6_2_ = (short)((ulong)lVar6 >> 0x30);
      local_10f8 = lVar1;
      uStack_10f0 = lVar2;
      local_1108 = (short)local_10d8 + (short)local_10e8;
      sStack_1106 = local_10d8._2_2_ + local_10e8._2_2_;
      sStack_1104 = local_10d8._4_2_ + local_10e8._4_2_;
      sStack_1102 = local_10d8._6_2_ + local_10e8._6_2_;
      sStack_1100 = (short)uStack_10d0 + (short)uStack_10e0;
      sStack_10fe = uStack_10d0._2_2_ + uStack_10e0._2_2_;
      sStack_10fc = uStack_10d0._4_2_ + uStack_10e0._4_2_;
      sStack_10fa = uStack_10d0._6_2_ + uStack_10e0._6_2_;
      local_10f8._0_2_ = (short)lVar1;
      local_10f8._2_2_ = (short)((ulong)lVar1 >> 0x10);
      local_10f8._4_2_ = (short)((ulong)lVar1 >> 0x20);
      local_10f8._6_2_ = (short)((ulong)lVar1 >> 0x30);
      uStack_10f0._0_2_ = (short)lVar2;
      uStack_10f0._2_2_ = (short)((ulong)lVar2 >> 0x10);
      uStack_10f0._4_2_ = (short)((ulong)lVar2 >> 0x20);
      uStack_10f0._6_2_ = (short)((ulong)lVar2 >> 0x30);
      local_1128 = (short)local_10f8 + (short)local_10d8 + (short)local_10e8;
      sStack_1126 = local_10f8._2_2_ + local_10d8._2_2_ + local_10e8._2_2_;
      sStack_1124 = local_10f8._4_2_ + local_10d8._4_2_ + local_10e8._4_2_;
      sStack_1122 = local_10f8._6_2_ + local_10d8._6_2_ + local_10e8._6_2_;
      sStack_1120 = (short)uStack_10f0 + (short)uStack_10d0 + (short)uStack_10e0;
      sStack_111e = uStack_10f0._2_2_ + uStack_10d0._2_2_ + uStack_10e0._2_2_;
      sStack_111c = uStack_10f0._4_2_ + uStack_10d0._4_2_ + uStack_10e0._4_2_;
      sStack_111a = uStack_10f0._6_2_ + uStack_10d0._6_2_ + uStack_10e0._6_2_;
      local_1118 = CONCAT26(sStack_15f2,CONCAT24(sStack_15f4,CONCAT22(sStack_15f6,local_15f8)));
      uStack_1110 = CONCAT26(sStack_15ea,CONCAT24(sStack_15ec,CONCAT22(sStack_15ee,sStack_15f0)));
      local_1148 = local_15f8 + local_1128;
      sStack_1146 = sStack_15f6 + sStack_1126;
      sStack_1144 = sStack_15f4 + sStack_1124;
      sStack_1142 = sStack_15f2 + sStack_1122;
      sStack_1140 = sStack_15f0 + sStack_1120;
      sStack_113e = sStack_15ee + sStack_111e;
      sStack_113c = sStack_15ec + sStack_111c;
      sStack_113a = sStack_15ea + sStack_111a;
      local_1138 = CONCAT26(sStack_15b2,CONCAT24(sStack_15b4,CONCAT22(sStack_15b6,local_15b8)));
      uStack_1130 = CONCAT26(sStack_15aa,CONCAT24(sStack_15ac,CONCAT22(sStack_15ae,sStack_15b0)));
      local_1528 = (ushort)(local_15b8 + local_1148) >> 4;
      uStack_1526 = (ushort)(sStack_15b6 + sStack_1146) >> 4;
      uStack_1524 = (ushort)(sStack_15b4 + sStack_1144) >> 4;
      uStack_1522 = (ushort)(sStack_15b2 + sStack_1142) >> 4;
      uStack_1520 = (ushort)(sStack_15b0 + sStack_1140) >> 4;
      uStack_151e = (ushort)(sStack_15ae + sStack_113e) >> 4;
      uStack_151c = (ushort)(sStack_15ac + sStack_113c) >> 4;
      uStack_151a = (ushort)(sStack_15aa + sStack_113a) >> 4;
    }
    for (local_1630 = 0; local_1630 < 2; local_1630 = local_1630 + 1) {
      uVar7 = local_1438[(long)local_1630 * 2 + 1];
      local_1438[(long)local_1630 * 2] = ~local_1408 & local_1438[(long)local_1630 * 2];
      local_1438[(long)local_1630 * 2 + 1] = ~uStack_1400 & uVar7;
      uStack_12d0 = *(ulong *)(&uStack_1480 + (long)local_1630 * 8);
      local_12c8 = local_1408;
      uStack_12c0 = uStack_1400;
      local_12d8 = *(ulong *)(&local_1488 + (long)local_1630 * 8);
      *(ulong *)(&local_1488 + (long)local_1630 * 8) =
           local_1408 & *(ulong *)(&local_1488 + (long)local_1630 * 8);
      *(ulong *)(&uStack_1480 + (long)local_1630 * 8) = uStack_1400 & uStack_12d0;
      lVar10 = (long)local_1630;
      uVar7 = local_1438[lVar10 * 2 + 1];
      uVar16 = *(ulong *)(&uStack_1480 + lVar10 * 8);
      local_1350[local_1630][0] = local_1438[lVar10 * 2] | *(ulong *)(&local_1488 + lVar10 * 8);
      local_1350[local_1630][1] = uVar7 | uVar16;
      local_238 = (uint)local_1408;
      uStack_234 = (uint)(local_1408 >> 0x20);
      uStack_230 = (uint)uStack_1400;
      uStack_22c = (uint)(uStack_1400 >> 0x20);
      local_248 = (uint)(&local_1458)[(long)local_1630 * 2];
      uStack_244 = (uint)((ulong)(&local_1458)[(long)local_1630 * 2] >> 0x20);
      uStack_240 = (uint)(&uStack_1450)[(long)local_1630 * 2];
      uStack_23c = (uint)((ulong)(&uStack_1450)[(long)local_1630 * 2] >> 0x20);
      lVar10 = (long)local_1630;
      *(uint *)(&local_1458 + lVar10 * 2) = (local_238 ^ 0xffffffff) & local_248;
      *(uint *)((long)&local_1458 + lVar10 * 0x10 + 4) = (uStack_234 ^ 0xffffffff) & uStack_244;
      *(uint *)(&uStack_1450 + lVar10 * 2) = (uStack_230 ^ 0xffffffff) & uStack_240;
      *(uint *)((long)&uStack_1450 + lVar10 * 0x10 + 4) = (uStack_22c ^ 0xffffffff) & uStack_23c;
      uStack_12f0 = *(ulong *)(&uStack_14b0 + (long)local_1630 * 8);
      local_12e8 = local_1408;
      uStack_12e0 = uStack_1400;
      local_12f8 = *(ulong *)(&local_14b8 + (long)local_1630 * 8);
      *(ulong *)(&local_14b8 + (long)local_1630 * 8) =
           local_1408 & *(ulong *)(&local_14b8 + (long)local_1630 * 8);
      *(ulong *)(&uStack_14b0 + (long)local_1630 * 8) = uStack_1400 & uStack_12f0;
      uVar7 = (&uStack_1450)[(long)local_1630 * 2];
      uVar16 = *(ulong *)(&uStack_14b0 + (long)local_1630 * 8);
      local_1358[local_1630][0] =
           (&local_1458)[(long)local_1630 * 2] | *(ulong *)(&local_14b8 + (long)local_1630 * 8);
      local_1358[local_1630][1] = uVar7 | uVar16;
    }
    uVar7 = local_1350[2][1];
    uVar16 = ~uStack_1400;
    local_1350[2][0] = ~local_1408 & local_1350[2][0];
    palVar21[2][1] = uVar16 & uVar7;
    palVar21 = local_1350;
    local_1208 = local_1408;
    uStack_1200 = uStack_1400;
    local_1218 = local_1468;
    uStack_1210 = uStack_1460;
    local_1468 = local_1408 & local_1468;
    uVar16 = uStack_1400 & uStack_1460;
    uStack_1460 = uVar16;
    uVar7 = local_1350[2][1];
    local_1350[2][0] = local_1350[2][0] | local_1468;
    palVar21[2][1] = uVar7 | uVar16;
    palVar21 = local_1358;
    local_178 = (uint)local_1408;
    uStack_174 = (uint)(local_1408 >> 0x20);
    uStack_170 = (uint)uStack_1400;
    uStack_16c = (uint)(uStack_1400 >> 0x20);
    local_188 = (uint)local_1358[2][0];
    uStack_184 = (uint)((ulong)local_1358[2][0] >> 0x20);
    uStack_180 = (uint)local_1358[2][1];
    uStack_17c = (uint)((ulong)local_1358[2][1] >> 0x20);
    *(uint *)local_1358[2] = (local_178 ^ 0xffffffff) & local_188;
    *(uint *)((long)palVar21[2] + 4) = (uStack_174 ^ 0xffffffff) & uStack_184;
    *(uint *)(palVar21[2] + 1) = (uStack_170 ^ 0xffffffff) & uStack_180;
    *(uint *)((long)palVar21[2] + 0xc) = (uStack_16c ^ 0xffffffff) & uStack_17c;
    palVar21 = local_1358;
    local_1228 = local_1408;
    uStack_1220 = uStack_1400;
    local_1238 = local_1498;
    uStack_1230 = uStack_1490;
    local_1498 = local_1408 & local_1498;
    uVar16 = uStack_1400 & uStack_1490;
    uStack_1490 = uVar16;
    uVar7 = local_1358[2][1];
    local_1358[2][0] = local_1358[2][0] | local_1498;
    palVar21[2][1] = uVar7 | uVar16;
    for (local_1630 = 0; local_1630 < 2; local_1630 = local_1630 + 1) {
      uVar7 = local_1438[(long)local_1630 * 2 + 1];
      local_1438[(long)local_1630 * 2] = ~local_1408 & local_1438[(long)local_1630 * 2];
      local_1438[(long)local_1630 * 2 + 1] = ~uStack_1400 & uVar7;
      uStack_1290 = *(ulong *)(&uStack_1480 + (long)local_1630 * 8);
      local_1288 = local_1408;
      uStack_1280 = uStack_1400;
      local_1298 = *(ulong *)(&local_1488 + (long)local_1630 * 8);
      *(ulong *)(&local_1488 + (long)local_1630 * 8) =
           local_1408 & *(ulong *)(&local_1488 + (long)local_1630 * 8);
      *(ulong *)(&uStack_1480 + (long)local_1630 * 8) = uStack_1400 & uStack_1290;
      lVar10 = (long)local_1630;
      uVar7 = local_1438[lVar10 * 2 + 1];
      uVar16 = *(ulong *)(&uStack_1480 + lVar10 * 8);
      local_1350[local_1630][0] = local_1438[lVar10 * 2] | *(ulong *)(&local_1488 + lVar10 * 8);
      local_1350[local_1630][1] = uVar7 | uVar16;
      local_1f8 = (uint)local_1408;
      uStack_1f4 = (uint)(local_1408 >> 0x20);
      uStack_1f0 = (uint)uStack_1400;
      uStack_1ec = (uint)(uStack_1400 >> 0x20);
      local_208 = (uint)(&local_1458)[(long)local_1630 * 2];
      uStack_204 = (uint)((ulong)(&local_1458)[(long)local_1630 * 2] >> 0x20);
      uStack_200 = (uint)(&uStack_1450)[(long)local_1630 * 2];
      uStack_1fc = (uint)((ulong)(&uStack_1450)[(long)local_1630 * 2] >> 0x20);
      lVar10 = (long)local_1630;
      *(uint *)(&local_1458 + lVar10 * 2) = (local_1f8 ^ 0xffffffff) & local_208;
      *(uint *)((long)&local_1458 + lVar10 * 0x10 + 4) = (uStack_1f4 ^ 0xffffffff) & uStack_204;
      *(uint *)(&uStack_1450 + lVar10 * 2) = (uStack_1f0 ^ 0xffffffff) & uStack_200;
      *(uint *)((long)&uStack_1450 + lVar10 * 0x10 + 4) = (uStack_1ec ^ 0xffffffff) & uStack_1fc;
      uStack_12b0 = *(ulong *)(&uStack_14b0 + (long)local_1630 * 8);
      local_12a8 = local_1408;
      uStack_12a0 = uStack_1400;
      local_12b8 = *(ulong *)(&local_14b8 + (long)local_1630 * 8);
      *(ulong *)(&local_14b8 + (long)local_1630 * 8) =
           local_1408 & *(ulong *)(&local_14b8 + (long)local_1630 * 8);
      *(ulong *)(&uStack_14b0 + (long)local_1630 * 8) = uStack_1400 & uStack_12b0;
      uVar7 = (&uStack_1450)[(long)local_1630 * 2];
      uVar16 = *(ulong *)(&uStack_14b0 + (long)local_1630 * 8);
      local_1358[local_1630][0] =
           (&local_1458)[(long)local_1630 * 2] | *(ulong *)(&local_14b8 + (long)local_1630 * 8);
      local_1358[local_1630][1] = uVar7 | uVar16;
    }
    if (local_162c != 0) {
      for (local_1630 = 0; local_1630 < 6; local_1630 = local_1630 + 1) {
        uVar7 = local_1350[local_1630][1];
        local_1350[local_1630][0] = ~local_1418 & local_1350[local_1630][0];
        local_1350[local_1630][1] = ~uStack_1410 & uVar7;
        uStack_1250 = (&uStack_1510)[(long)local_1630 * 2];
        local_1248 = local_1418;
        uStack_1240 = uStack_1410;
        local_1258 = (&local_1518)[(long)local_1630 * 2];
        (&local_1518)[(long)local_1630 * 2] = local_1418 & (&local_1518)[(long)local_1630 * 2];
        (&uStack_1510)[(long)local_1630 * 2] = uStack_1410 & uStack_1250;
        lVar10 = (long)local_1630;
        uVar7 = local_1350[lVar10][1];
        uVar16 = (&uStack_1510)[lVar10 * 2];
        local_1350[local_1630][0] = local_1350[lVar10][0] | (&local_1518)[lVar10 * 2];
        local_1350[local_1630][1] = uVar7 | uVar16;
        lVar1 = local_1358[local_1630][0];
        lVar2 = local_1358[local_1630][1];
        local_1b8 = (uint)local_1418;
        uStack_1b4 = (uint)(local_1418 >> 0x20);
        uStack_1b0 = (uint)uStack_1410;
        uStack_1ac = (uint)(uStack_1410 >> 0x20);
        local_1c8 = (uint)lVar1;
        uStack_1c4 = (uint)((ulong)lVar1 >> 0x20);
        uStack_1c0 = (uint)lVar2;
        uStack_1bc = (uint)((ulong)lVar2 >> 0x20);
        palVar21 = local_1358 + local_1630;
        *(uint *)*palVar21 = (local_1b8 ^ 0xffffffff) & local_1c8;
        *(uint *)((long)*palVar21 + 4) = (uStack_1b4 ^ 0xffffffff) & uStack_1c4;
        *(uint *)(*palVar21 + 1) = (uStack_1b0 ^ 0xffffffff) & uStack_1c0;
        *(uint *)((long)*palVar21 + 0xc) = (uStack_1ac ^ 0xffffffff) & uStack_1bc;
        uStack_1270 = (&uStack_1570)[(long)local_1630 * 2];
        local_1268 = local_1418;
        uStack_1260 = uStack_1410;
        local_1278 = (&local_1578)[(long)local_1630 * 2];
        (&local_1578)[(long)local_1630 * 2] = local_1418 & (&local_1578)[(long)local_1630 * 2];
        (&uStack_1570)[(long)local_1630 * 2] = uStack_1410 & uStack_1270;
        uVar7 = local_1358[local_1630][1];
        uVar16 = (&uStack_1570)[(long)local_1630 * 2];
        local_1358[local_1630][0] = local_1358[local_1630][0] | (&local_1578)[(long)local_1630 * 2];
        local_1358[local_1630][1] = uVar7 | uVar16;
      }
    }
  }
  for (local_174c = 0; local_174c < 6; local_174c = local_174c + 1) {
    local_1310 = local_1638 + -(long)((local_174c + 1) * local_163c);
    lStack_1320 = local_16d8[(long)local_174c * 2 + 1];
    local_1328 = local_16d8[(long)local_174c * 2];
    *(longlong *)local_1310 = local_16d8[(long)local_174c * 2];
    *(longlong *)(local_1310 + 4) = lStack_1320;
    local_1330 = local_1638 + local_174c * local_163c;
    lStack_1340 = local_1748[(long)local_174c * 2 + 1];
    local_1348 = local_1748[(long)local_174c * 2];
    *(longlong *)local_1330 = local_1748[(long)local_174c * 2];
    *(longlong *)(local_1330 + 4) = lStack_1340;
  }
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p[7], q[7];
  int i;
  load_highbd_pixel(s, 7, pitch, p, q);

  highbd_lpf_internal_14_dual_sse2(p, q, _blimit0, _limit0, _thresh0, _blimit1,
                                   _limit1, _thresh1, bd);

  for (i = 0; i < 6; i++) {
    _mm_storeu_si128((__m128i *)(s - (i + 1) * pitch), p[i]);
    _mm_storeu_si128((__m128i *)(s + i * pitch), q[i]);
  }
}